

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  RTCRayQueryContext *pRVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  size_t k;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [28];
  uint uVar83;
  uint uVar84;
  int iVar85;
  ulong uVar86;
  uint uVar87;
  long lVar88;
  long lVar89;
  undefined8 *puVar90;
  long lVar91;
  ulong uVar92;
  ulong uVar93;
  long lVar94;
  long lVar95;
  ulong *puVar96;
  NodeRef root;
  ulong uVar97;
  undefined4 uVar98;
  ulong unaff_R14;
  undefined1 (*pauVar99) [32];
  bool bVar100;
  float fVar101;
  undefined1 auVar109 [16];
  float fVar128;
  float fVar131;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar134;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  __m128 a;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 in_ZMM2 [64];
  __m128 a_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar191;
  undefined1 auVar186 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar207 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar214 [64];
  float fVar221;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  Precalculations pre;
  vfloat<4> lower_y;
  vfloat<4> upper_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  vfloat<4> lower_x;
  vfloat<4> upper_x;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2f59;
  RayK<8> *local_2f58;
  RayQueryContext *local_2f50;
  long local_2f48;
  undefined1 local_2f40 [32];
  undefined1 local_2f20 [48];
  RayK<8> *local_2ef0;
  long local_2ee8;
  undefined1 local_2ee0 [32];
  undefined1 local_2ec0 [32];
  undefined1 local_2ea0 [32];
  undefined1 local_2e80 [32];
  RTCFilterFunctionNArguments local_2e50;
  undefined1 local_2e20 [32];
  undefined1 local_2e00 [32];
  undefined1 local_2de0 [40];
  undefined1 (*local_2db8) [32];
  BVH *local_2db0;
  ulong local_2da8;
  undefined1 local_2da0 [32];
  undefined1 local_2d80 [8];
  float fStack_2d78;
  float fStack_2d74;
  float fStack_2d70;
  float fStack_2d6c;
  float fStack_2d68;
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [16];
  undefined1 local_2d30 [16];
  undefined1 local_2d20 [8];
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  undefined1 local_2d00 [8];
  float fStack_2cf8;
  float fStack_2cf4;
  float fStack_2cf0;
  float fStack_2cec;
  float fStack_2ce8;
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [8];
  float fStack_2c78;
  float fStack_2c74;
  float fStack_2c70;
  float fStack_2c6c;
  float fStack_2c68;
  Intersectors *local_2c48;
  long local_2c40;
  long local_2c38;
  long local_2c30;
  ulong local_2c28;
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [8];
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  uint local_2b20;
  uint uStack_2b1c;
  uint uStack_2b18;
  uint uStack_2b14;
  uint local_2b10;
  uint uStack_2b0c;
  uint uStack_2b08;
  uint uStack_2b04;
  undefined1 local_2b00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2ae0;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [8];
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  undefined1 local_2a00 [8];
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  RTCHitN local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined4 local_2880;
  undefined4 uStack_287c;
  undefined4 uStack_2878;
  undefined4 uStack_2874;
  undefined4 uStack_2870;
  undefined4 uStack_286c;
  undefined4 uStack_2868;
  undefined4 uStack_2864;
  uint local_2860;
  uint uStack_285c;
  uint uStack_2858;
  uint uStack_2854;
  uint uStack_2850;
  uint uStack_284c;
  uint uStack_2848;
  uint uStack_2844;
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [16];
  undefined8 local_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 local_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 local_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 local_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 local_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined4 local_26c0;
  undefined4 uStack_26bc;
  undefined4 uStack_26b8;
  undefined4 uStack_26b4;
  undefined4 uStack_26b0;
  undefined4 uStack_26ac;
  undefined4 uStack_26a8;
  undefined4 uStack_26a4;
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 uStack_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  undefined4 uStack_2684;
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 uStack_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar187 [64];
  undefined1 auVar211 [64];
  
  local_2db0 = (BVH *)This->ptr;
  if ((local_2db0->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar127 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar102 = ZEXT816(0) << 0x40;
      auVar120 = vpcmpeqd_avx2(auVar127,(undefined1  [32])valid_i->field_0);
      auVar127 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar102),5);
      auVar145 = auVar120 & auVar127;
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar145 >> 0x7f,0) != '\0') ||
            (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar145 >> 0xbf,0) != '\0') ||
          (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar145[0x1f] < '\0') {
        auVar127 = vandps_avx(auVar127,auVar120);
        auVar141 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
        local_2ae0._0_8_ = *(undefined8 *)ray;
        local_2ae0._8_8_ = *(undefined8 *)(ray + 8);
        local_2ae0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2ae0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2ae0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2ae0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2ae0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2ae0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2ae0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2ae0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2ae0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2ae0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2a80 = *(undefined1 (*) [32])(ray + 0x80);
        local_2a60 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2b00._8_4_ = 0x7fffffff;
        local_2b00._0_8_ = 0x7fffffff7fffffff;
        local_2b00._12_4_ = 0x7fffffff;
        local_2b00._16_4_ = 0x7fffffff;
        local_2b00._20_4_ = 0x7fffffff;
        local_2b00._24_4_ = 0x7fffffff;
        local_2b00._28_4_ = 0x7fffffff;
        auVar121._8_4_ = 0x219392ef;
        auVar121._0_8_ = 0x219392ef219392ef;
        auVar121._12_4_ = 0x219392ef;
        auVar121._16_4_ = 0x219392ef;
        auVar121._20_4_ = 0x219392ef;
        auVar121._24_4_ = 0x219392ef;
        auVar121._28_4_ = 0x219392ef;
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = &DAT_3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar126._16_4_ = 0x3f800000;
        auVar126._20_4_ = 0x3f800000;
        auVar126._24_4_ = 0x3f800000;
        auVar126._28_4_ = 0x3f800000;
        local_2a40 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar172 = vdivps_avx(auVar126,local_2a80);
        auVar127 = vandps_avx(local_2b00,local_2a80);
        auVar145 = vcmpps_avx(auVar127,auVar121,1);
        auVar127 = vandps_avx(local_2b00,local_2a60);
        auVar120 = vcmpps_avx(auVar127,auVar121,1);
        auVar197 = ZEXT3264(auVar120);
        auVar182 = vdivps_avx(auVar126,local_2a60);
        auVar127 = vandps_avx(local_2b00,local_2a40);
        auVar207._8_4_ = 0x5d5e0b6b;
        auVar207._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar207._12_4_ = 0x5d5e0b6b;
        auVar207._16_4_ = 0x5d5e0b6b;
        auVar207._20_4_ = 0x5d5e0b6b;
        auVar207._24_4_ = 0x5d5e0b6b;
        auVar207._28_4_ = 0x5d5e0b6b;
        auVar211 = ZEXT3264(auVar207);
        _local_2a20 = vblendvps_avx(auVar172,auVar207,auVar145);
        auVar127 = vcmpps_avx(auVar127,auVar121,1);
        auVar145 = vdivps_avx(auVar126,local_2a40);
        _local_2a00 = vblendvps_avx(auVar182,auVar207,auVar120);
        _local_29e0 = vblendvps_avx(auVar145,auVar207,auVar127);
        auVar127 = vcmpps_avx(_local_2a20,ZEXT1632(auVar102),1);
        auVar182._8_4_ = 0x10;
        auVar182._0_8_ = 0x1000000010;
        auVar182._12_4_ = 0x10;
        auVar182._16_4_ = 0x10;
        auVar182._20_4_ = 0x10;
        auVar182._24_4_ = 0x10;
        auVar182._28_4_ = 0x10;
        local_29c0 = vandps_avx(auVar127,auVar182);
        auVar145 = ZEXT1632(auVar102);
        auVar127 = vcmpps_avx(_local_2a00,auVar145,5);
        auVar120._8_4_ = 0x20;
        auVar120._0_8_ = 0x2000000020;
        auVar120._12_4_ = 0x20;
        auVar120._16_4_ = 0x20;
        auVar120._20_4_ = 0x20;
        auVar120._24_4_ = 0x20;
        auVar120._28_4_ = 0x20;
        auVar183._8_4_ = 0x30;
        auVar183._0_8_ = 0x3000000030;
        auVar183._12_4_ = 0x30;
        auVar183._16_4_ = 0x30;
        auVar183._20_4_ = 0x30;
        auVar183._24_4_ = 0x30;
        auVar183._28_4_ = 0x30;
        local_29a0 = vblendvps_avx(auVar183,auVar120,auVar127);
        auVar127 = vcmpps_avx(_local_29e0,auVar145,5);
        auVar172._8_4_ = 0x40;
        auVar172._0_8_ = 0x4000000040;
        auVar172._12_4_ = 0x40;
        auVar172._16_4_ = 0x40;
        auVar172._20_4_ = 0x40;
        auVar172._24_4_ = 0x40;
        auVar172._28_4_ = 0x40;
        auVar184._8_4_ = 0x50;
        auVar184._0_8_ = 0x5000000050;
        auVar184._12_4_ = 0x50;
        auVar184._16_4_ = 0x50;
        auVar184._20_4_ = 0x50;
        auVar184._24_4_ = 0x50;
        auVar184._28_4_ = 0x50;
        auVar187 = ZEXT3264(auVar184);
        local_2980 = vblendvps_avx(auVar184,auVar172,auVar127);
        auVar127 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar145);
        local_2700 = vpmovsxwd_avx2(auVar141);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar213 = ZEXT3264(local_1e80);
        local_2960 = vblendvps_avx(local_1e80,auVar127,local_2700);
        auVar127 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar145);
        auVar145._8_4_ = 0xff800000;
        auVar145._0_8_ = 0xff800000ff800000;
        auVar145._12_4_ = 0xff800000;
        auVar145._16_4_ = 0xff800000;
        auVar145._20_4_ = 0xff800000;
        auVar145._24_4_ = 0xff800000;
        auVar145._28_4_ = 0xff800000;
        local_2940 = vblendvps_avx(auVar145,auVar127,local_2700);
        auVar102 = vpcmpeqd_avx(local_2940._0_16_,local_2940._0_16_);
        local_2c20 = vpmovsxwd_avx2(auVar141 ^ auVar102);
        local_2c48 = This;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar93 = 5;
        }
        else {
          uVar93 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2ef0 = ray + 0x100;
        puVar96 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar99 = (undefined1 (*) [32])local_1e40;
        local_2608 = (local_2db0->root).ptr;
        local_1e60 = local_2960;
        local_2db8 = (undefined1 (*) [32])&local_2840;
        local_2da8 = uVar93;
        local_2f58 = ray;
        local_2f50 = context;
        do {
          pauVar99 = pauVar99 + -1;
          root.ptr = puVar96[-1];
          puVar96 = puVar96 + -1;
          if (root.ptr == 0xfffffffffffffff8) {
LAB_005cd8d8:
            iVar85 = 3;
          }
          else {
            local_2f40 = *pauVar99;
            auVar224 = ZEXT3264(local_2f40);
            auVar127 = vcmpps_avx(local_2f40,local_2940,1);
            if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar127 >> 0x7f,0) == '\0') &&
                  (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar127 >> 0xbf,0) == '\0') &&
                (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar127[0x1f]) {
LAB_005cd8e9:
              iVar85 = 2;
            }
            else {
              uVar98 = vmovmskps_avx(auVar127);
              unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar98);
              iVar85 = 0;
              if ((uint)POPCOUNT(uVar98) <= uVar93) {
                for (; unaff_R14 != 0; unaff_R14 = unaff_R14 - 1 & unaff_R14) {
                  k = 0;
                  for (uVar93 = unaff_R14; (uVar93 & 1) == 0;
                      uVar93 = uVar93 >> 1 | 0x8000000000000000) {
                    k = k + 1;
                  }
                  local_2f20._0_8_ = k;
                  auVar187 = ZEXT1664(auVar187._0_16_);
                  auVar197 = ZEXT1664(auVar197._0_16_);
                  auVar211 = ZEXT1664(auVar211._0_16_);
                  bVar100 = occluded1(local_2c48,local_2db0,root,k,&local_2f59,ray,
                                      (TravRayK<8,_true> *)&local_2ae0.field_0,context);
                  if (bVar100) {
                    *(undefined4 *)(local_2c20 + local_2f20._0_8_ * 4) = 0xffffffff;
                  }
                  auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar224 = ZEXT3264(local_2f40);
                  uVar93 = local_2da8;
                  ray = local_2f58;
                  context = local_2f50;
                }
                auVar127 = _DAT_0205a980 & ~local_2c20;
                iVar85 = 3;
                unaff_R14 = 0;
                if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar127 >> 0x7f,0) != '\0') ||
                      (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar127 >> 0xbf,0) != '\0') ||
                    (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar127[0x1f] < '\0') {
                  auVar127._8_4_ = 0xff800000;
                  auVar127._0_8_ = 0xff800000ff800000;
                  auVar127._12_4_ = 0xff800000;
                  auVar127._16_4_ = 0xff800000;
                  auVar127._20_4_ = 0xff800000;
                  auVar127._24_4_ = 0xff800000;
                  auVar127._28_4_ = 0xff800000;
                  local_2940 = vblendvps_avx(local_2940,auVar127,local_2c20);
                  iVar85 = 2;
                }
              }
              if ((uint)uVar93 < (uint)POPCOUNT(uVar98)) {
                do {
                  if ((root.ptr & 8) != 0) {
                    if (root.ptr == 0xfffffffffffffff8) goto LAB_005cd8d8;
                    auVar127 = vcmpps_avx(local_2940,auVar224._0_32_,6);
                    if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar127 >> 0x7f,0) != '\0') ||
                          (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar127 >> 0xbf,0) != '\0') ||
                        (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar127[0x1f] < '\0') {
                      local_2c40 = (ulong)((uint)root.ptr & 0xf) - 8;
                      auVar119 = local_2c20;
                      if (local_2c40 != 0) {
                        uVar97 = root.ptr & 0xfffffffffffffff0;
                        auVar224 = ZEXT3264(CONCAT428(local_2c20._28_4_ ^ 0xffffffff,
                                                      CONCAT424(local_2c20._24_4_ ^ 0xffffffff,
                                                                CONCAT420(local_2c20._20_4_ ^
                                                                          0xffffffff,
                                                                          CONCAT416(local_2c20.
                                                                                    _16_4_ ^ 
                                                  0xffffffff,
                                                  CONCAT412(local_2c20._12_4_ ^ 0xffffffff,
                                                            CONCAT48(local_2c20._8_4_ ^ 0xffffffff,
                                                                     local_2c20._0_8_ ^
                                                                     0xffffffffffffffff)))))));
                        lVar88 = 0;
                        do {
                          local_2c38 = lVar88;
                          lVar88 = lVar88 * 0x58;
                          auVar102._8_8_ = 0;
                          auVar102._0_8_ = *(ulong *)(uVar97 + 0x20 + lVar88);
                          auVar141._8_8_ = 0;
                          auVar141._0_8_ = *(ulong *)(uVar97 + 0x24 + lVar88);
                          auVar141 = vpminub_avx(auVar102,auVar141);
                          auVar102 = vpcmpeqb_avx(auVar102,auVar141);
                          auVar141 = vpcmpeqd_avx(auVar141,auVar141);
                          auVar102 = vpmovzxbd_avx(auVar102 ^ auVar141);
                          auVar102 = vpslld_avx(auVar102 ^ auVar141,0x1f);
                          uVar83 = vmovmskps_avx(auVar102);
                          if (uVar83 != 0) {
                            lVar88 = lVar88 + uVar97;
                            uVar92 = (ulong)(uVar83 & 0xff);
                            local_2c30 = lVar88;
                            do {
                              lVar91 = 0;
                              for (uVar86 = uVar92; (uVar86 & 1) == 0;
                                  uVar86 = uVar86 >> 1 | 0x8000000000000000) {
                                lVar91 = lVar91 + 1;
                              }
                              auVar103._8_8_ = 0;
                              auVar103._0_8_ = *(ulong *)(lVar88 + 0x20);
                              auVar102 = vpmovzxbd_avx(auVar103);
                              auVar102 = vcvtdq2ps_avx(auVar102);
                              uVar98 = *(undefined4 *)(lVar88 + 0x44);
                              auVar142._4_4_ = uVar98;
                              auVar142._0_4_ = uVar98;
                              auVar142._8_4_ = uVar98;
                              auVar142._12_4_ = uVar98;
                              uVar98 = *(undefined4 *)(lVar88 + 0x38);
                              auVar155._4_4_ = uVar98;
                              auVar155._0_4_ = uVar98;
                              auVar155._8_4_ = uVar98;
                              auVar155._12_4_ = uVar98;
                              auVar102 = vfmadd213ps_fma(auVar102,auVar142,auVar155);
                              local_2920[0] = (RTCHitN)auVar102[0];
                              local_2920[1] = (RTCHitN)auVar102[1];
                              local_2920[2] = (RTCHitN)auVar102[2];
                              local_2920[3] = (RTCHitN)auVar102[3];
                              local_2920[4] = (RTCHitN)auVar102[4];
                              local_2920[5] = (RTCHitN)auVar102[5];
                              local_2920[6] = (RTCHitN)auVar102[6];
                              local_2920[7] = (RTCHitN)auVar102[7];
                              local_2920[8] = (RTCHitN)auVar102[8];
                              local_2920[9] = (RTCHitN)auVar102[9];
                              local_2920[10] = (RTCHitN)auVar102[10];
                              local_2920[0xb] = (RTCHitN)auVar102[0xb];
                              local_2920[0xc] = (RTCHitN)auVar102[0xc];
                              local_2920[0xd] = (RTCHitN)auVar102[0xd];
                              local_2920[0xe] = (RTCHitN)auVar102[0xe];
                              local_2920[0xf] = (RTCHitN)auVar102[0xf];
                              auVar104._8_8_ = 0;
                              auVar104._0_8_ = *(ulong *)(lVar88 + 0x24);
                              auVar102 = vpmovzxbd_avx(auVar104);
                              auVar102 = vcvtdq2ps_avx(auVar102);
                              local_2800 = vfmadd213ps_fma(auVar102,auVar142,auVar155);
                              auVar105._8_8_ = 0;
                              auVar105._0_8_ = *(ulong *)(lVar88 + 0x28);
                              auVar102 = vpmovzxbd_avx(auVar105);
                              auVar102 = vcvtdq2ps_avx(auVar102);
                              uVar98 = *(undefined4 *)(lVar88 + 0x48);
                              auVar143._4_4_ = uVar98;
                              auVar143._0_4_ = uVar98;
                              auVar143._8_4_ = uVar98;
                              auVar143._12_4_ = uVar98;
                              uVar98 = *(undefined4 *)(lVar88 + 0x3c);
                              auVar156._4_4_ = uVar98;
                              auVar156._0_4_ = uVar98;
                              auVar156._8_4_ = uVar98;
                              auVar156._12_4_ = uVar98;
                              auVar102 = vfmadd213ps_fma(auVar102,auVar143,auVar156);
                              local_2e50.valid = (int *)auVar102._0_8_;
                              local_2e50.geometryUserPtr = (void *)auVar102._8_8_;
                              auVar106._8_8_ = 0;
                              auVar106._0_8_ = *(ulong *)(lVar88 + 0x2c);
                              auVar102 = vpmovzxbd_avx(auVar106);
                              auVar102 = vcvtdq2ps_avx(auVar102);
                              auVar102 = vfmadd213ps_fma(auVar102,auVar143,auVar156);
                              local_2d60._0_16_ = auVar102;
                              auVar107._8_8_ = 0;
                              auVar107._0_8_ = *(ulong *)(lVar88 + 0x30);
                              auVar102 = vpmovzxbd_avx(auVar107);
                              auVar102 = vcvtdq2ps_avx(auVar102);
                              uVar98 = *(undefined4 *)(lVar88 + 0x4c);
                              auVar144._4_4_ = uVar98;
                              auVar144._0_4_ = uVar98;
                              auVar144._8_4_ = uVar98;
                              auVar144._12_4_ = uVar98;
                              uVar98 = *(undefined4 *)(lVar88 + 0x40);
                              auVar157._4_4_ = uVar98;
                              auVar157._0_4_ = uVar98;
                              auVar157._8_4_ = uVar98;
                              auVar157._12_4_ = uVar98;
                              local_2d30 = vfmadd213ps_fma(auVar102,auVar144,auVar157);
                              auVar108._8_8_ = 0;
                              auVar108._0_8_ = *(ulong *)(lVar88 + 0x34);
                              auVar102 = vpmovzxbd_avx(auVar108);
                              auVar102 = vcvtdq2ps_avx(auVar102);
                              local_2d40 = vfmadd213ps_fma(auVar102,auVar144,auVar157);
                              uVar86 = (ulong)(uint)((int)lVar91 * 4);
                              uVar98 = *(undefined4 *)(local_2920 + uVar86);
                              auVar116._4_4_ = uVar98;
                              auVar116._0_4_ = uVar98;
                              auVar116._8_4_ = uVar98;
                              auVar116._12_4_ = uVar98;
                              auVar116._16_4_ = uVar98;
                              auVar116._20_4_ = uVar98;
                              auVar116._24_4_ = uVar98;
                              auVar116._28_4_ = uVar98;
                              auVar74._8_8_ = local_2ae0._8_8_;
                              auVar74._0_8_ = local_2ae0._0_8_;
                              auVar74._16_8_ = local_2ae0._16_8_;
                              auVar74._24_8_ = local_2ae0._24_8_;
                              auVar76._8_8_ = local_2ae0._40_8_;
                              auVar76._0_8_ = local_2ae0._32_8_;
                              auVar76._16_8_ = local_2ae0._48_8_;
                              auVar76._24_8_ = local_2ae0._56_8_;
                              auVar78._8_8_ = local_2ae0._72_8_;
                              auVar78._0_8_ = local_2ae0._64_8_;
                              auVar78._16_8_ = local_2ae0._80_8_;
                              auVar78._24_8_ = local_2ae0._88_8_;
                              auVar127 = vsubps_avx(auVar116,auVar74);
                              auVar16._4_4_ = (float)local_2a20._4_4_ * auVar127._4_4_;
                              auVar16._0_4_ = (float)local_2a20._0_4_ * auVar127._0_4_;
                              auVar16._8_4_ = fStack_2a18 * auVar127._8_4_;
                              auVar16._12_4_ = fStack_2a14 * auVar127._12_4_;
                              auVar16._16_4_ = fStack_2a10 * auVar127._16_4_;
                              auVar16._20_4_ = fStack_2a0c * auVar127._20_4_;
                              auVar16._24_4_ = fStack_2a08 * auVar127._24_4_;
                              auVar16._28_4_ = auVar127._28_4_;
                              uVar98 = *(undefined4 *)((long)&local_2e50.valid + uVar86);
                              auVar185._4_4_ = uVar98;
                              auVar185._0_4_ = uVar98;
                              auVar185._8_4_ = uVar98;
                              auVar185._12_4_ = uVar98;
                              auVar185._16_4_ = uVar98;
                              auVar185._20_4_ = uVar98;
                              auVar185._24_4_ = uVar98;
                              auVar185._28_4_ = uVar98;
                              auVar127 = vsubps_avx(auVar185,auVar76);
                              auVar18._4_4_ = (float)local_2a00._4_4_ * auVar127._4_4_;
                              auVar18._0_4_ = (float)local_2a00._0_4_ * auVar127._0_4_;
                              auVar18._8_4_ = fStack_29f8 * auVar127._8_4_;
                              auVar18._12_4_ = fStack_29f4 * auVar127._12_4_;
                              auVar18._16_4_ = fStack_29f0 * auVar127._16_4_;
                              auVar18._20_4_ = fStack_29ec * auVar127._20_4_;
                              auVar18._24_4_ = fStack_29e8 * auVar127._24_4_;
                              auVar18._28_4_ = auVar127._28_4_;
                              auVar187 = ZEXT3264(auVar18);
                              uVar98 = *(undefined4 *)(local_2d30 + uVar86);
                              auVar194._4_4_ = uVar98;
                              auVar194._0_4_ = uVar98;
                              auVar194._8_4_ = uVar98;
                              auVar194._12_4_ = uVar98;
                              auVar194._16_4_ = uVar98;
                              auVar194._20_4_ = uVar98;
                              auVar194._24_4_ = uVar98;
                              auVar194._28_4_ = uVar98;
                              auVar127 = vsubps_avx(auVar194,auVar78);
                              auVar17._4_4_ = (float)local_29e0._4_4_ * auVar127._4_4_;
                              auVar17._0_4_ = (float)local_29e0._0_4_ * auVar127._0_4_;
                              auVar17._8_4_ = fStack_29d8 * auVar127._8_4_;
                              auVar17._12_4_ = fStack_29d4 * auVar127._12_4_;
                              auVar17._16_4_ = fStack_29d0 * auVar127._16_4_;
                              auVar17._20_4_ = fStack_29cc * auVar127._20_4_;
                              auVar17._24_4_ = fStack_29c8 * auVar127._24_4_;
                              auVar17._28_4_ = auVar127._28_4_;
                              auVar197 = ZEXT3264(auVar17);
                              uVar98 = *(undefined4 *)(local_2800 + uVar86);
                              auVar208._4_4_ = uVar98;
                              auVar208._0_4_ = uVar98;
                              auVar208._8_4_ = uVar98;
                              auVar208._12_4_ = uVar98;
                              auVar208._16_4_ = uVar98;
                              auVar208._20_4_ = uVar98;
                              auVar208._24_4_ = uVar98;
                              auVar208._28_4_ = uVar98;
                              auVar211 = ZEXT3264(auVar208);
                              auVar127 = vsubps_avx(auVar208,auVar74);
                              auVar19._4_4_ = (float)local_2a20._4_4_ * auVar127._4_4_;
                              auVar19._0_4_ = (float)local_2a20._0_4_ * auVar127._0_4_;
                              auVar19._8_4_ = fStack_2a18 * auVar127._8_4_;
                              auVar19._12_4_ = fStack_2a14 * auVar127._12_4_;
                              auVar19._16_4_ = fStack_2a10 * auVar127._16_4_;
                              auVar19._20_4_ = fStack_2a0c * auVar127._20_4_;
                              auVar19._24_4_ = fStack_2a08 * auVar127._24_4_;
                              auVar19._28_4_ = auVar127._28_4_;
                              uVar98 = *(undefined4 *)(local_2d60 + uVar86);
                              auVar173._4_4_ = uVar98;
                              auVar173._0_4_ = uVar98;
                              auVar173._8_4_ = uVar98;
                              auVar173._12_4_ = uVar98;
                              auVar173._16_4_ = uVar98;
                              auVar173._20_4_ = uVar98;
                              auVar173._24_4_ = uVar98;
                              auVar173._28_4_ = uVar98;
                              auVar127 = vsubps_avx(auVar173,auVar76);
                              auVar25._4_4_ = (float)local_2a00._4_4_ * auVar127._4_4_;
                              auVar25._0_4_ = (float)local_2a00._0_4_ * auVar127._0_4_;
                              auVar25._8_4_ = fStack_29f8 * auVar127._8_4_;
                              auVar25._12_4_ = fStack_29f4 * auVar127._12_4_;
                              auVar25._16_4_ = fStack_29f0 * auVar127._16_4_;
                              auVar25._20_4_ = fStack_29ec * auVar127._20_4_;
                              auVar25._24_4_ = fStack_29e8 * auVar127._24_4_;
                              auVar25._28_4_ = auVar127._28_4_;
                              uVar98 = *(undefined4 *)(local_2d40 + uVar86);
                              auVar174._4_4_ = uVar98;
                              auVar174._0_4_ = uVar98;
                              auVar174._8_4_ = uVar98;
                              auVar174._12_4_ = uVar98;
                              auVar174._16_4_ = uVar98;
                              auVar174._20_4_ = uVar98;
                              auVar174._24_4_ = uVar98;
                              auVar174._28_4_ = uVar98;
                              auVar127 = vsubps_avx(auVar174,auVar78);
                              auVar26._4_4_ = (float)local_29e0._4_4_ * auVar127._4_4_;
                              auVar26._0_4_ = (float)local_29e0._0_4_ * auVar127._0_4_;
                              auVar26._8_4_ = fStack_29d8 * auVar127._8_4_;
                              auVar26._12_4_ = fStack_29d4 * auVar127._12_4_;
                              auVar26._16_4_ = fStack_29d0 * auVar127._16_4_;
                              auVar26._20_4_ = fStack_29cc * auVar127._20_4_;
                              auVar26._24_4_ = fStack_29c8 * auVar127._24_4_;
                              auVar26._28_4_ = auVar127._28_4_;
                              auVar127 = vminps_avx(auVar16,auVar19);
                              auVar145 = vminps_avx(auVar18,auVar25);
                              auVar127 = vmaxps_avx(auVar127,auVar145);
                              auVar145 = vminps_avx(auVar17,auVar26);
                              auVar127 = vmaxps_avx(auVar127,auVar145);
                              auVar27._4_4_ = auVar127._4_4_ * 0.99999964;
                              auVar27._0_4_ = auVar127._0_4_ * 0.99999964;
                              auVar27._8_4_ = auVar127._8_4_ * 0.99999964;
                              auVar27._12_4_ = auVar127._12_4_ * 0.99999964;
                              auVar27._16_4_ = auVar127._16_4_ * 0.99999964;
                              auVar27._20_4_ = auVar127._20_4_ * 0.99999964;
                              auVar27._24_4_ = auVar127._24_4_ * 0.99999964;
                              auVar27._28_4_ = auVar127._28_4_;
                              auVar127 = vmaxps_avx(auVar16,auVar19);
                              auVar145 = vmaxps_avx(auVar18,auVar25);
                              auVar145 = vminps_avx(auVar127,auVar145);
                              auVar127 = vmaxps_avx(auVar17,auVar26);
                              auVar127 = vminps_avx(auVar145,auVar127);
                              auVar28._4_4_ = auVar127._4_4_ * 1.0000004;
                              auVar28._0_4_ = auVar127._0_4_ * 1.0000004;
                              auVar28._8_4_ = auVar127._8_4_ * 1.0000004;
                              auVar28._12_4_ = auVar127._12_4_ * 1.0000004;
                              auVar28._16_4_ = auVar127._16_4_ * 1.0000004;
                              auVar28._20_4_ = auVar127._20_4_ * 1.0000004;
                              auVar28._24_4_ = auVar127._24_4_ * 1.0000004;
                              auVar28._28_4_ = auVar127._28_4_;
                              auVar127 = vmaxps_avx(auVar27,local_2960);
                              auVar145 = vminps_avx(auVar28,local_2940);
                              auVar127 = vcmpps_avx(auVar127,auVar145,2);
                              auVar145 = auVar224._0_32_;
                              auVar127 = auVar145 & auVar127;
                              if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar127 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar127 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar127 >> 0x7f,0) == '\0')
                                    && (auVar127 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar127 >> 0xbf,0) == '\0')
                                  && (auVar127 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar127[0x1f]) {
                                bVar100 = false;
                              }
                              else {
                                local_2c28 = uVar92;
                                uVar5 = *(ushort *)(lVar88 + lVar91 * 8);
                                uVar6 = *(ushort *)(lVar88 + 2 + lVar91 * 8);
                                local_2b10 = *(uint *)(lVar88 + 0x50);
                                local_2b20 = *(uint *)(lVar88 + 4 + lVar91 * 8);
                                pGVar8 = (context->scene->geometries).items[local_2b10].ptr;
                                lVar91 = *(long *)&pGVar8->field_0x58;
                                lVar9 = *(long *)&pGVar8[1].time_range.upper;
                                lVar94 = (ulong)local_2b20 *
                                         pGVar8[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                                uVar84 = uVar5 & 0x7fff;
                                uVar87 = uVar6 & 0x7fff;
                                uVar83 = *(uint *)(lVar91 + 4 + lVar94);
                                uVar92 = (ulong)uVar83;
                                uVar86 = (ulong)(uVar83 * uVar87 +
                                                *(int *)(lVar91 + lVar94) + uVar84);
                                p_Var10 = pGVar8[1].intersectionFilterN;
                                puVar90 = (undefined8 *)(lVar9 + (uVar86 + 1) * (long)p_Var10);
                                local_27f0 = *puVar90;
                                uStack_27e8 = puVar90[1];
                                lVar88 = uVar86 + uVar92;
                                puVar90 = (undefined8 *)(lVar9 + lVar88 * (long)p_Var10);
                                local_27d0 = *puVar90;
                                uStack_27c8 = puVar90[1];
                                lVar95 = uVar86 + uVar92 + 1;
                                puVar90 = (undefined8 *)(lVar9 + lVar95 * (long)p_Var10);
                                local_27e0 = *puVar90;
                                uStack_27d8 = puVar90[1];
                                uVar93 = (ulong)(-1 < (short)uVar5);
                                puVar90 = (undefined8 *)
                                          (lVar9 + (uVar86 + uVar93 + 1) * (long)p_Var10);
                                lVar89 = uVar93 + lVar95;
                                puVar2 = (undefined8 *)(lVar9 + lVar89 * (long)p_Var10);
                                local_27a0 = *puVar2;
                                uStack_2798 = puVar2[1];
                                if ((short)uVar6 < 0) {
                                  uVar92 = 0;
                                }
                                puVar2 = (undefined8 *)(lVar9 + (lVar88 + uVar92) * (long)p_Var10);
                                puVar3 = (undefined8 *)(lVar9 + (lVar95 + uVar92) * (long)p_Var10);
                                local_2760 = *puVar3;
                                uStack_2758 = puVar3[1];
                                puVar3 = (undefined8 *)(lVar9 + (uVar92 + lVar89) * (long)p_Var10);
                                local_2800 = *(undefined1 (*) [16])(lVar9 + (long)p_Var10 * uVar86);
                                local_27c0 = local_27f0;
                                uStack_27b8 = uStack_27e8;
                                local_27b0 = *puVar90;
                                uStack_27a8 = puVar90[1];
                                local_2790 = local_27e0;
                                uStack_2788 = uStack_27d8;
                                local_2780 = local_27d0;
                                uStack_2778 = uStack_27c8;
                                local_2770 = local_27e0;
                                uStack_2768 = uStack_27d8;
                                local_2750 = *puVar2;
                                uStack_2748 = puVar2[1];
                                local_2740 = local_27e0;
                                uStack_2738 = uStack_27d8;
                                local_2730 = local_27a0;
                                uStack_2728 = uStack_2798;
                                local_2720 = *puVar3;
                                uStack_2718 = puVar3[1];
                                local_2710 = local_2760;
                                uStack_2708 = uStack_2758;
                                uStack_2b0c = local_2b10;
                                uStack_2b08 = local_2b10;
                                uStack_2b04 = local_2b10;
                                uStack_2b1c = local_2b20;
                                uStack_2b18 = local_2b20;
                                uStack_2b14 = local_2b20;
                                puVar90 = &uStack_27c8;
                                unaff_R14 = 0;
                                local_26e0 = auVar145;
                                auVar214 = ZEXT3264(auVar145);
                                ray = local_2f58;
                                context = local_2f50;
                                local_2f48 = lVar94;
                                local_2ee8 = lVar91;
                                do {
                                  auVar172 = auVar214._0_32_;
                                  uVar98 = *(undefined4 *)(puVar90 + -7);
                                  auVar117._4_4_ = uVar98;
                                  auVar117._0_4_ = uVar98;
                                  auVar117._8_4_ = uVar98;
                                  auVar117._12_4_ = uVar98;
                                  auVar117._16_4_ = uVar98;
                                  auVar117._20_4_ = uVar98;
                                  auVar117._24_4_ = uVar98;
                                  auVar117._28_4_ = uVar98;
                                  uVar98 = *(undefined4 *)((long)puVar90 + -0x34);
                                  auVar146._4_4_ = uVar98;
                                  auVar146._0_4_ = uVar98;
                                  auVar146._8_4_ = uVar98;
                                  auVar146._12_4_ = uVar98;
                                  auVar146._16_4_ = uVar98;
                                  auVar146._20_4_ = uVar98;
                                  auVar146._24_4_ = uVar98;
                                  auVar146._28_4_ = uVar98;
                                  uVar98 = *(undefined4 *)(puVar90 + -6);
                                  auVar159._4_4_ = uVar98;
                                  auVar159._0_4_ = uVar98;
                                  auVar159._8_4_ = uVar98;
                                  auVar159._12_4_ = uVar98;
                                  auVar159._16_4_ = uVar98;
                                  auVar159._20_4_ = uVar98;
                                  auVar159._24_4_ = uVar98;
                                  auVar159._28_4_ = uVar98;
                                  uVar98 = *(undefined4 *)(puVar90 + -1);
                                  local_2ba0._4_4_ = uVar98;
                                  local_2ba0._0_4_ = uVar98;
                                  local_2ba0._8_4_ = uVar98;
                                  local_2ba0._12_4_ = uVar98;
                                  local_2ba0._16_4_ = uVar98;
                                  local_2ba0._20_4_ = uVar98;
                                  local_2ba0._24_4_ = uVar98;
                                  local_2ba0._28_4_ = uVar98;
                                  uVar4 = *(undefined4 *)((long)puVar90 + -4);
                                  local_2bc0._4_4_ = uVar4;
                                  local_2bc0._0_4_ = uVar4;
                                  local_2bc0._8_4_ = uVar4;
                                  local_2bc0._12_4_ = uVar4;
                                  local_2bc0._16_4_ = uVar4;
                                  local_2bc0._20_4_ = uVar4;
                                  local_2bc0._24_4_ = uVar4;
                                  local_2bc0._28_4_ = uVar4;
                                  uVar4 = *(undefined4 *)puVar90;
                                  local_2be0._4_4_ = uVar4;
                                  local_2be0._0_4_ = uVar4;
                                  local_2be0._8_4_ = uVar4;
                                  local_2be0._12_4_ = uVar4;
                                  local_2be0._16_4_ = uVar4;
                                  local_2be0._20_4_ = uVar4;
                                  local_2be0._24_4_ = uVar4;
                                  local_2be0._28_4_ = uVar4;
                                  local_2d30._4_4_ = uStack_2b0c;
                                  local_2d30._0_4_ = local_2b10;
                                  local_2d30._12_4_ = uStack_2b04;
                                  local_2d30._8_4_ = uStack_2b08;
                                  local_2d40._4_4_ = uStack_2b1c;
                                  local_2d40._0_4_ = local_2b20;
                                  local_2d40._12_4_ = uStack_2b14;
                                  local_2d40._8_4_ = uStack_2b18;
                                  auVar127 = *(undefined1 (*) [32])ray;
                                  auVar145 = *(undefined1 (*) [32])(ray + 0x20);
                                  auVar120 = *(undefined1 (*) [32])(ray + 0x40);
                                  local_2ce0 = vsubps_avx(auVar117,auVar127);
                                  _local_2d80 = vsubps_avx(auVar146,auVar145);
                                  local_2e00 = vsubps_avx(auVar159,auVar120);
                                  auVar182 = vsubps_avx(local_2bc0,auVar145);
                                  local_2da0 = vsubps_avx(local_2be0,auVar120);
                                  local_2ca0 = vsubps_avx(auVar182,_local_2d80);
                                  local_2e20 = vsubps_avx(local_2da0,local_2e00);
                                  auVar192._0_4_ = auVar182._0_4_ + local_2d80._0_4_;
                                  auVar192._4_4_ = auVar182._4_4_ + local_2d80._4_4_;
                                  auVar192._8_4_ = auVar182._8_4_ + local_2d80._8_4_;
                                  auVar192._12_4_ = auVar182._12_4_ + local_2d80._12_4_;
                                  auVar192._16_4_ = auVar182._16_4_ + local_2d80._16_4_;
                                  auVar192._20_4_ = auVar182._20_4_ + local_2d80._20_4_;
                                  auVar192._24_4_ = auVar182._24_4_ + local_2d80._24_4_;
                                  auVar192._28_4_ = auVar182._28_4_ + local_2d80._28_4_;
                                  fVar140 = local_2e00._0_4_;
                                  auVar195._0_4_ = local_2da0._0_4_ + fVar140;
                                  fVar130 = local_2e00._4_4_;
                                  auVar195._4_4_ = local_2da0._4_4_ + fVar130;
                                  fVar133 = local_2e00._8_4_;
                                  auVar195._8_4_ = local_2da0._8_4_ + fVar133;
                                  fVar136 = local_2e00._12_4_;
                                  auVar195._12_4_ = local_2da0._12_4_ + fVar136;
                                  fVar188 = local_2e00._16_4_;
                                  auVar195._16_4_ = local_2da0._16_4_ + fVar188;
                                  fVar189 = local_2e00._20_4_;
                                  auVar195._20_4_ = local_2da0._20_4_ + fVar189;
                                  fVar190 = local_2e00._24_4_;
                                  auVar195._24_4_ = local_2da0._24_4_ + fVar190;
                                  fVar101 = local_2e00._28_4_;
                                  fVar191 = local_2da0._28_4_;
                                  auVar195._28_4_ = fVar191 + fVar101;
                                  auVar187._0_4_ = auVar192._0_4_ * local_2e20._0_4_;
                                  auVar187._4_4_ = auVar192._4_4_ * local_2e20._4_4_;
                                  auVar187._8_4_ = auVar192._8_4_ * local_2e20._8_4_;
                                  auVar187._12_4_ = auVar192._12_4_ * local_2e20._12_4_;
                                  auVar187._16_4_ = auVar192._16_4_ * local_2e20._16_4_;
                                  auVar187._20_4_ = auVar192._20_4_ * local_2e20._20_4_;
                                  auVar187._28_36_ = auVar224._28_36_;
                                  auVar187._24_4_ = auVar192._24_4_ * local_2e20._24_4_;
                                  auVar141 = vfmsub231ps_fma(auVar187._0_32_,local_2ca0,auVar195);
                                  auVar183 = vsubps_avx(local_2ba0,auVar127);
                                  local_2b40 = vsubps_avx(auVar183,local_2ce0);
                                  auVar29._4_4_ = auVar195._4_4_ * local_2b40._4_4_;
                                  auVar29._0_4_ = auVar195._0_4_ * local_2b40._0_4_;
                                  auVar29._8_4_ = auVar195._8_4_ * local_2b40._8_4_;
                                  auVar29._12_4_ = auVar195._12_4_ * local_2b40._12_4_;
                                  auVar29._16_4_ = auVar195._16_4_ * local_2b40._16_4_;
                                  auVar29._20_4_ = auVar195._20_4_ * local_2b40._20_4_;
                                  auVar29._24_4_ = auVar195._24_4_ * local_2b40._24_4_;
                                  auVar29._28_4_ = uVar98;
                                  auVar196._0_4_ = auVar183._0_4_ + local_2ce0._0_4_;
                                  auVar196._4_4_ = auVar183._4_4_ + local_2ce0._4_4_;
                                  auVar196._8_4_ = auVar183._8_4_ + local_2ce0._8_4_;
                                  auVar196._12_4_ = auVar183._12_4_ + local_2ce0._12_4_;
                                  auVar196._16_4_ = auVar183._16_4_ + local_2ce0._16_4_;
                                  auVar196._20_4_ = auVar183._20_4_ + local_2ce0._20_4_;
                                  auVar196._24_4_ = auVar183._24_4_ + local_2ce0._24_4_;
                                  auVar196._28_4_ = auVar183._28_4_ + local_2ce0._28_4_;
                                  auVar102 = vfmsub231ps_fma(auVar29,local_2e20,auVar196);
                                  auVar30._4_4_ = auVar196._4_4_ * local_2ca0._4_4_;
                                  auVar30._0_4_ = auVar196._0_4_ * local_2ca0._0_4_;
                                  auVar30._8_4_ = auVar196._8_4_ * local_2ca0._8_4_;
                                  auVar30._12_4_ = auVar196._12_4_ * local_2ca0._12_4_;
                                  auVar30._16_4_ = auVar196._16_4_ * local_2ca0._16_4_;
                                  auVar30._20_4_ = auVar196._20_4_ * local_2ca0._20_4_;
                                  auVar30._24_4_ = auVar196._24_4_ * local_2ca0._24_4_;
                                  auVar30._28_4_ = local_2ca0._28_4_;
                                  auVar103 = vfmsub231ps_fma(auVar30,local_2b40,auVar192);
                                  pRVar1 = ray + 0xc0;
                                  fVar128 = *(float *)pRVar1;
                                  fVar131 = *(float *)(ray + 0xc4);
                                  fVar134 = *(float *)(ray + 200);
                                  fVar137 = *(float *)(ray + 0xcc);
                                  fVar138 = *(float *)(ray + 0xd0);
                                  fVar139 = *(float *)(ray + 0xd4);
                                  fVar72 = *(float *)(ray + 0xd8);
                                  auVar82 = *(undefined1 (*) [28])pRVar1;
                                  auVar31._4_4_ = fVar131 * auVar103._4_4_;
                                  auVar31._0_4_ = fVar128 * auVar103._0_4_;
                                  auVar31._8_4_ = fVar134 * auVar103._8_4_;
                                  auVar31._12_4_ = fVar137 * auVar103._12_4_;
                                  auVar31._16_4_ = fVar138 * 0.0;
                                  auVar31._20_4_ = fVar139 * 0.0;
                                  auVar31._24_4_ = fVar72 * 0.0;
                                  auVar31._28_4_ = auVar192._28_4_;
                                  local_2b60 = *(undefined1 (*) [32])(ray + 0xa0);
                                  auVar102 = vfmadd231ps_fma(auVar31,local_2b60,ZEXT1632(auVar102));
                                  uVar98 = *(undefined4 *)(puVar90 + -5);
                                  local_2c00._4_4_ = uVar98;
                                  local_2c00._0_4_ = uVar98;
                                  local_2c00._8_4_ = uVar98;
                                  local_2c00._12_4_ = uVar98;
                                  local_2c00._16_4_ = uVar98;
                                  local_2c00._20_4_ = uVar98;
                                  local_2c00._24_4_ = uVar98;
                                  local_2c00._28_4_ = uVar98;
                                  local_2de0._0_32_ = *(undefined1 (*) [32])(ray + 0x80);
                                  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_2de0._0_32_,
                                                             ZEXT1632(auVar141));
                                  auVar127 = vsubps_avx(local_2c00,auVar127);
                                  uVar98 = *(undefined4 *)((long)puVar90 + -0x24);
                                  local_2640._4_4_ = uVar98;
                                  local_2640._0_4_ = uVar98;
                                  local_2640._8_4_ = uVar98;
                                  local_2640._12_4_ = uVar98;
                                  local_2640._16_4_ = uVar98;
                                  local_2640._20_4_ = uVar98;
                                  local_2640._24_4_ = uVar98;
                                  local_2640._28_4_ = uVar98;
                                  auVar145 = vsubps_avx(local_2640,auVar145);
                                  uVar98 = *(undefined4 *)(puVar90 + -4);
                                  local_2660._4_4_ = uVar98;
                                  local_2660._0_4_ = uVar98;
                                  local_2660._8_4_ = uVar98;
                                  local_2660._12_4_ = uVar98;
                                  local_2660._16_4_ = uVar98;
                                  local_2660._20_4_ = uVar98;
                                  local_2660._24_4_ = uVar98;
                                  local_2660._28_4_ = uVar98;
                                  auVar120 = vsubps_avx(local_2660,auVar120);
                                  auVar184 = vsubps_avx(_local_2d80,auVar145);
                                  auVar207 = vsubps_avx(local_2e00,auVar120);
                                  auVar222._0_4_ = local_2d80._0_4_ + auVar145._0_4_;
                                  auVar222._4_4_ = local_2d80._4_4_ + auVar145._4_4_;
                                  auVar222._8_4_ = local_2d80._8_4_ + auVar145._8_4_;
                                  auVar222._12_4_ = local_2d80._12_4_ + auVar145._12_4_;
                                  auVar222._16_4_ = local_2d80._16_4_ + auVar145._16_4_;
                                  auVar222._20_4_ = local_2d80._20_4_ + auVar145._20_4_;
                                  auVar222._24_4_ = local_2d80._24_4_ + auVar145._24_4_;
                                  auVar222._28_4_ = local_2d80._28_4_ + auVar145._28_4_;
                                  auVar147._0_4_ = fVar140 + auVar120._0_4_;
                                  auVar147._4_4_ = fVar130 + auVar120._4_4_;
                                  auVar147._8_4_ = fVar133 + auVar120._8_4_;
                                  auVar147._12_4_ = fVar136 + auVar120._12_4_;
                                  auVar147._16_4_ = fVar188 + auVar120._16_4_;
                                  auVar147._20_4_ = fVar189 + auVar120._20_4_;
                                  auVar147._24_4_ = fVar190 + auVar120._24_4_;
                                  auVar147._28_4_ = fVar101 + auVar120._28_4_;
                                  fVar129 = auVar207._0_4_;
                                  fVar132 = auVar207._4_4_;
                                  auVar32._4_4_ = auVar222._4_4_ * fVar132;
                                  auVar32._0_4_ = auVar222._0_4_ * fVar129;
                                  fVar135 = auVar207._8_4_;
                                  auVar32._8_4_ = auVar222._8_4_ * fVar135;
                                  fVar12 = auVar207._12_4_;
                                  auVar32._12_4_ = auVar222._12_4_ * fVar12;
                                  fVar13 = auVar207._16_4_;
                                  auVar32._16_4_ = auVar222._16_4_ * fVar13;
                                  fVar14 = auVar207._20_4_;
                                  auVar32._20_4_ = auVar222._20_4_ * fVar14;
                                  fVar15 = auVar207._24_4_;
                                  auVar32._24_4_ = auVar222._24_4_ * fVar15;
                                  auVar32._28_4_ = fVar101;
                                  auVar103 = vfmsub231ps_fma(auVar32,auVar184,auVar147);
                                  auVar121 = vsubps_avx(local_2ce0,auVar127);
                                  fVar215 = auVar121._0_4_;
                                  fVar216 = auVar121._4_4_;
                                  auVar33._4_4_ = fVar216 * auVar147._4_4_;
                                  auVar33._0_4_ = fVar215 * auVar147._0_4_;
                                  fVar217 = auVar121._8_4_;
                                  auVar33._8_4_ = fVar217 * auVar147._8_4_;
                                  fVar218 = auVar121._12_4_;
                                  auVar33._12_4_ = fVar218 * auVar147._12_4_;
                                  fVar219 = auVar121._16_4_;
                                  auVar33._16_4_ = fVar219 * auVar147._16_4_;
                                  fVar220 = auVar121._20_4_;
                                  auVar33._20_4_ = fVar220 * auVar147._20_4_;
                                  fVar221 = auVar121._24_4_;
                                  auVar33._24_4_ = fVar221 * auVar147._24_4_;
                                  auVar33._28_4_ = auVar147._28_4_;
                                  auVar175._0_4_ = local_2ce0._0_4_ + auVar127._0_4_;
                                  auVar175._4_4_ = local_2ce0._4_4_ + auVar127._4_4_;
                                  auVar175._8_4_ = local_2ce0._8_4_ + auVar127._8_4_;
                                  auVar175._12_4_ = local_2ce0._12_4_ + auVar127._12_4_;
                                  auVar175._16_4_ = local_2ce0._16_4_ + auVar127._16_4_;
                                  auVar175._20_4_ = local_2ce0._20_4_ + auVar127._20_4_;
                                  auVar175._24_4_ = local_2ce0._24_4_ + auVar127._24_4_;
                                  auVar175._28_4_ = local_2ce0._28_4_ + auVar127._28_4_;
                                  auVar141 = vfmsub231ps_fma(auVar33,auVar207,auVar175);
                                  fVar199 = auVar184._0_4_;
                                  fVar201 = auVar184._4_4_;
                                  auVar34._4_4_ = fVar201 * auVar175._4_4_;
                                  auVar34._0_4_ = fVar199 * auVar175._0_4_;
                                  fVar202 = auVar184._8_4_;
                                  auVar34._8_4_ = fVar202 * auVar175._8_4_;
                                  fVar203 = auVar184._12_4_;
                                  auVar34._12_4_ = fVar203 * auVar175._12_4_;
                                  fVar204 = auVar184._16_4_;
                                  auVar34._16_4_ = fVar204 * auVar175._16_4_;
                                  fVar205 = auVar184._20_4_;
                                  auVar34._20_4_ = fVar205 * auVar175._20_4_;
                                  fVar206 = auVar184._24_4_;
                                  auVar34._24_4_ = fVar206 * auVar175._24_4_;
                                  auVar34._28_4_ = auVar175._28_4_;
                                  auVar104 = vfmsub231ps_fma(auVar34,auVar121,auVar222);
                                  auVar35._4_4_ = fVar131 * auVar104._4_4_;
                                  auVar35._0_4_ = fVar128 * auVar104._0_4_;
                                  auVar35._8_4_ = fVar134 * auVar104._8_4_;
                                  auVar35._12_4_ = fVar137 * auVar104._12_4_;
                                  auVar35._16_4_ = fVar138 * 0.0;
                                  auVar35._20_4_ = fVar139 * 0.0;
                                  auVar35._24_4_ = fVar72 * 0.0;
                                  auVar35._28_4_ = auVar196._28_4_;
                                  auVar141 = vfmadd231ps_fma(auVar35,local_2b60,ZEXT1632(auVar141));
                                  auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),local_2de0._0_32_,
                                                             ZEXT1632(auVar103));
                                  local_2f40 = ZEXT1632(auVar141);
                                  auVar126 = vsubps_avx(auVar127,auVar183);
                                  auVar148._0_4_ = auVar183._0_4_ + auVar127._0_4_;
                                  auVar148._4_4_ = auVar183._4_4_ + auVar127._4_4_;
                                  auVar148._8_4_ = auVar183._8_4_ + auVar127._8_4_;
                                  auVar148._12_4_ = auVar183._12_4_ + auVar127._12_4_;
                                  auVar148._16_4_ = auVar183._16_4_ + auVar127._16_4_;
                                  auVar148._20_4_ = auVar183._20_4_ + auVar127._20_4_;
                                  auVar148._24_4_ = auVar183._24_4_ + auVar127._24_4_;
                                  auVar148._28_4_ = auVar183._28_4_ + auVar127._28_4_;
                                  auVar119 = vsubps_avx(auVar145,auVar182);
                                  auVar160._0_4_ = auVar182._0_4_ + auVar145._0_4_;
                                  auVar160._4_4_ = auVar182._4_4_ + auVar145._4_4_;
                                  auVar160._8_4_ = auVar182._8_4_ + auVar145._8_4_;
                                  auVar160._12_4_ = auVar182._12_4_ + auVar145._12_4_;
                                  auVar160._16_4_ = auVar182._16_4_ + auVar145._16_4_;
                                  auVar160._20_4_ = auVar182._20_4_ + auVar145._20_4_;
                                  auVar160._24_4_ = auVar182._24_4_ + auVar145._24_4_;
                                  auVar160._28_4_ = auVar182._28_4_ + auVar145._28_4_;
                                  auVar16 = vsubps_avx(auVar120,local_2da0);
                                  auVar118._0_4_ = auVar120._0_4_ + local_2da0._0_4_;
                                  auVar118._4_4_ = auVar120._4_4_ + local_2da0._4_4_;
                                  auVar118._8_4_ = auVar120._8_4_ + local_2da0._8_4_;
                                  auVar118._12_4_ = auVar120._12_4_ + local_2da0._12_4_;
                                  auVar118._16_4_ = auVar120._16_4_ + local_2da0._16_4_;
                                  auVar118._20_4_ = auVar120._20_4_ + local_2da0._20_4_;
                                  auVar118._24_4_ = auVar120._24_4_ + local_2da0._24_4_;
                                  auVar118._28_4_ = auVar120._28_4_ + fVar191;
                                  auVar36._4_4_ = auVar16._4_4_ * auVar160._4_4_;
                                  auVar36._0_4_ = auVar16._0_4_ * auVar160._0_4_;
                                  auVar36._8_4_ = auVar16._8_4_ * auVar160._8_4_;
                                  auVar36._12_4_ = auVar16._12_4_ * auVar160._12_4_;
                                  auVar36._16_4_ = auVar16._16_4_ * auVar160._16_4_;
                                  auVar36._20_4_ = auVar16._20_4_ * auVar160._20_4_;
                                  auVar36._24_4_ = auVar16._24_4_ * auVar160._24_4_;
                                  auVar36._28_4_ = fVar191;
                                  auVar104 = vfmsub231ps_fma(auVar36,auVar119,auVar118);
                                  auVar37._4_4_ = auVar126._4_4_ * auVar118._4_4_;
                                  auVar37._0_4_ = auVar126._0_4_ * auVar118._0_4_;
                                  auVar37._8_4_ = auVar126._8_4_ * auVar118._8_4_;
                                  auVar37._12_4_ = auVar126._12_4_ * auVar118._12_4_;
                                  auVar37._16_4_ = auVar126._16_4_ * auVar118._16_4_;
                                  auVar37._20_4_ = auVar126._20_4_ * auVar118._20_4_;
                                  auVar37._24_4_ = auVar126._24_4_ * auVar118._24_4_;
                                  auVar37._28_4_ = auVar118._28_4_;
                                  auVar103 = vfmsub231ps_fma(auVar37,auVar16,auVar148);
                                  auVar38._4_4_ = auVar119._4_4_ * auVar148._4_4_;
                                  auVar38._0_4_ = auVar119._0_4_ * auVar148._0_4_;
                                  auVar38._8_4_ = auVar119._8_4_ * auVar148._8_4_;
                                  auVar38._12_4_ = auVar119._12_4_ * auVar148._12_4_;
                                  auVar38._16_4_ = auVar119._16_4_ * auVar148._16_4_;
                                  auVar38._20_4_ = auVar119._20_4_ * auVar148._20_4_;
                                  auVar38._24_4_ = auVar119._24_4_ * auVar148._24_4_;
                                  auVar38._28_4_ = auVar148._28_4_;
                                  auVar105 = vfmsub231ps_fma(auVar38,auVar126,auVar160);
                                  _local_2b80 = *(undefined1 (*) [32])pRVar1;
                                  auVar17 = _local_2b80;
                                  auVar149._0_4_ = fVar128 * auVar105._0_4_;
                                  auVar149._4_4_ = fVar131 * auVar105._4_4_;
                                  auVar149._8_4_ = fVar134 * auVar105._8_4_;
                                  auVar149._12_4_ = fVar137 * auVar105._12_4_;
                                  auVar149._16_4_ = fVar138 * 0.0;
                                  auVar149._20_4_ = fVar139 * 0.0;
                                  auVar149._24_4_ = fVar72 * 0.0;
                                  auVar149._28_4_ = 0;
                                  auVar103 = vfmadd231ps_fma(auVar149,local_2b60,ZEXT1632(auVar103))
                                  ;
                                  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_2de0._0_32_,
                                                             ZEXT1632(auVar104));
                                  _local_2c80 = ZEXT1632(CONCAT412(auVar103._12_4_ +
                                                                   auVar102._12_4_ + auVar141._12_4_
                                                                   ,CONCAT48(auVar103._8_4_ +
                                                                             auVar102._8_4_ +
                                                                             auVar141._8_4_,
                                                                             CONCAT44(auVar103._4_4_
                                                                                      + auVar102.
                                                  _4_4_ + auVar141._4_4_,
                                                  auVar103._0_4_ + auVar102._0_4_ + auVar141._0_4_))
                                                  ));
                                  auVar145 = vandps_avx(_local_2c80,local_2b00);
                                  fVar101 = auVar145._0_4_ * 1.1920929e-07;
                                  fVar128 = auVar145._4_4_ * 1.1920929e-07;
                                  auVar39._4_4_ = fVar128;
                                  auVar39._0_4_ = fVar101;
                                  fVar131 = auVar145._8_4_ * 1.1920929e-07;
                                  auVar39._8_4_ = fVar131;
                                  fVar134 = auVar145._12_4_ * 1.1920929e-07;
                                  auVar39._12_4_ = fVar134;
                                  fVar137 = auVar145._16_4_ * 1.1920929e-07;
                                  auVar39._16_4_ = fVar137;
                                  fVar138 = auVar145._20_4_ * 1.1920929e-07;
                                  auVar39._20_4_ = fVar138;
                                  fVar139 = auVar145._24_4_ * 1.1920929e-07;
                                  auVar39._24_4_ = fVar139;
                                  auVar39._28_4_ = auVar145._28_4_;
                                  auVar127 = ZEXT1632(auVar102);
                                  auVar120 = vminps_avx(auVar127,ZEXT1632(auVar141));
                                  auVar120 = vminps_avx(auVar120,ZEXT1632(auVar103));
                                  auVar209._8_4_ = 0x80000000;
                                  auVar209._0_8_ = 0x8000000080000000;
                                  auVar209._12_4_ = 0x80000000;
                                  auVar209._16_4_ = 0x80000000;
                                  auVar209._20_4_ = 0x80000000;
                                  auVar209._24_4_ = 0x80000000;
                                  auVar209._28_4_ = 0x80000000;
                                  auVar211 = ZEXT3264(auVar209);
                                  auVar170._0_8_ = CONCAT44(fVar128,fVar101) ^ 0x8000000080000000;
                                  auVar170._8_4_ = -fVar131;
                                  auVar170._12_4_ = -fVar134;
                                  auVar170._16_4_ = -fVar137;
                                  auVar170._20_4_ = -fVar138;
                                  auVar170._24_4_ = -fVar139;
                                  auVar170._28_4_ = auVar145._28_4_ ^ 0x80000000;
                                  auVar120 = vcmpps_avx(auVar120,auVar170,5);
                                  local_2da0 = auVar127;
                                  auVar182 = vmaxps_avx(auVar127,ZEXT1632(auVar141));
                                  auVar183 = vmaxps_avx(auVar182,ZEXT1632(auVar103));
                                  auVar145 = vcmpps_avx(auVar183,auVar39,2);
                                  auVar145 = vorps_avx(auVar120,auVar145);
                                  auVar18 = auVar172 & auVar145;
                                  auVar145 = vandps_avx(auVar145,auVar172);
                                  auVar197 = ZEXT3264(auVar145);
                                  local_2680 = *(undefined4 *)(puVar90 + -3);
                                  uStack_267c = local_2680;
                                  uStack_2678 = local_2680;
                                  uStack_2674 = local_2680;
                                  uStack_2670 = local_2680;
                                  uStack_266c = local_2680;
                                  uStack_2668 = local_2680;
                                  uStack_2664 = local_2680;
                                  local_26a0 = *(undefined4 *)((long)puVar90 + -0x14);
                                  uStack_269c = local_26a0;
                                  uStack_2698 = local_26a0;
                                  uStack_2694 = local_26a0;
                                  uStack_2690 = local_26a0;
                                  uStack_268c = local_26a0;
                                  uStack_2688 = local_26a0;
                                  uStack_2684 = local_26a0;
                                  local_26c0 = *(undefined4 *)(puVar90 + -2);
                                  uStack_26bc = local_26c0;
                                  uStack_26b8 = local_26c0;
                                  uStack_26b4 = local_26c0;
                                  uStack_26b0 = local_26c0;
                                  uStack_26ac = local_26c0;
                                  uStack_26a8 = local_26c0;
                                  uStack_26a4 = local_26c0;
                                  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar18 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar18 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar18 >> 0x7f,0) == '\0') &&
                                        (auVar18 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar18 >> 0xbf,0) == '\0')
                                      && (auVar18 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) && -1 < auVar18[0x1f]) {
LAB_005cd086:
                                    local_2f40 = _local_2d20;
                                    _local_2c80 = local_2cc0;
                                    auVar127 = _local_2d00;
                                    auVar207 = local_2ea0;
                                    auVar182 = local_2ec0;
                                    auVar126 = local_2ee0;
                                    auVar183 = local_2e80;
                                  }
                                  else {
                                    auVar40._4_4_ = fVar201 * local_2e20._4_4_;
                                    auVar40._0_4_ = fVar199 * local_2e20._0_4_;
                                    auVar40._8_4_ = fVar202 * local_2e20._8_4_;
                                    auVar40._12_4_ = fVar203 * local_2e20._12_4_;
                                    auVar40._16_4_ = fVar204 * local_2e20._16_4_;
                                    auVar40._20_4_ = fVar205 * local_2e20._20_4_;
                                    auVar40._24_4_ = fVar206 * local_2e20._24_4_;
                                    auVar40._28_4_ = local_26c0;
                                    auVar41._4_4_ = fVar216 * local_2ca0._4_4_;
                                    auVar41._0_4_ = fVar215 * local_2ca0._0_4_;
                                    auVar41._8_4_ = fVar217 * local_2ca0._8_4_;
                                    auVar41._12_4_ = fVar218 * local_2ca0._12_4_;
                                    auVar41._16_4_ = fVar219 * local_2ca0._16_4_;
                                    auVar41._20_4_ = fVar220 * local_2ca0._20_4_;
                                    auVar41._24_4_ = fVar221 * local_2ca0._24_4_;
                                    auVar41._28_4_ = auVar183._28_4_;
                                    auVar102 = vfmsub213ps_fma(local_2ca0,auVar207,auVar40);
                                    auVar42._4_4_ = auVar119._4_4_ * fVar132;
                                    auVar42._0_4_ = auVar119._0_4_ * fVar129;
                                    auVar42._8_4_ = auVar119._8_4_ * fVar135;
                                    auVar42._12_4_ = auVar119._12_4_ * fVar12;
                                    auVar42._16_4_ = auVar119._16_4_ * fVar13;
                                    auVar42._20_4_ = auVar119._20_4_ * fVar14;
                                    auVar42._24_4_ = auVar119._24_4_ * fVar15;
                                    auVar42._28_4_ = auVar120._28_4_;
                                    auVar43._4_4_ = fVar216 * auVar16._4_4_;
                                    auVar43._0_4_ = fVar215 * auVar16._0_4_;
                                    auVar43._8_4_ = fVar217 * auVar16._8_4_;
                                    auVar43._12_4_ = fVar218 * auVar16._12_4_;
                                    auVar43._16_4_ = fVar219 * auVar16._16_4_;
                                    auVar43._20_4_ = fVar220 * auVar16._20_4_;
                                    auVar43._24_4_ = fVar221 * auVar16._24_4_;
                                    auVar43._28_4_ = auVar182._28_4_;
                                    auVar141 = vfmsub213ps_fma(auVar16,auVar184,auVar42);
                                    auVar120 = vandps_avx(auVar40,local_2b00);
                                    auVar182 = vandps_avx(auVar42,local_2b00);
                                    auVar120 = vcmpps_avx(auVar120,auVar182,1);
                                    auVar183 = vblendvps_avx(ZEXT1632(auVar141),ZEXT1632(auVar102),
                                                             auVar120);
                                    auVar44._4_4_ = auVar126._4_4_ * fVar201;
                                    auVar44._0_4_ = auVar126._0_4_ * fVar199;
                                    auVar44._8_4_ = auVar126._8_4_ * fVar202;
                                    auVar44._12_4_ = auVar126._12_4_ * fVar203;
                                    auVar44._16_4_ = auVar126._16_4_ * fVar204;
                                    auVar44._20_4_ = auVar126._20_4_ * fVar205;
                                    auVar44._24_4_ = auVar126._24_4_ * fVar206;
                                    auVar44._28_4_ = auVar120._28_4_;
                                    auVar102 = vfmsub213ps_fma(auVar126,auVar207,auVar43);
                                    auVar45._4_4_ = fVar132 * local_2b40._4_4_;
                                    auVar45._0_4_ = fVar129 * local_2b40._0_4_;
                                    auVar45._8_4_ = fVar135 * local_2b40._8_4_;
                                    auVar45._12_4_ = fVar12 * local_2b40._12_4_;
                                    auVar45._16_4_ = fVar13 * local_2b40._16_4_;
                                    auVar45._20_4_ = fVar14 * local_2b40._20_4_;
                                    auVar45._24_4_ = fVar15 * local_2b40._24_4_;
                                    auVar45._28_4_ = auVar182._28_4_;
                                    auVar141 = vfmsub213ps_fma(local_2e20,auVar121,auVar45);
                                    auVar120 = vandps_avx(auVar45,local_2b00);
                                    auVar182 = vandps_avx(auVar43,local_2b00);
                                    auVar120 = vcmpps_avx(auVar120,auVar182,1);
                                    auVar207 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar141),
                                                             auVar120);
                                    auVar102 = vfmsub213ps_fma(local_2b40,auVar184,auVar41);
                                    auVar141 = vfmsub213ps_fma(auVar119,auVar121,auVar44);
                                    auVar120 = vandps_avx(auVar41,local_2b00);
                                    auVar182 = vandps_avx(auVar44,local_2b00);
                                    auVar120 = vcmpps_avx(auVar120,auVar182,1);
                                    auVar182 = vblendvps_avx(ZEXT1632(auVar141),ZEXT1632(auVar102),
                                                             auVar120);
                                    local_2b80._0_4_ = auVar82._0_4_;
                                    local_2b80._4_4_ = auVar82._4_4_;
                                    fStack_2b78 = auVar82._8_4_;
                                    fStack_2b74 = auVar82._12_4_;
                                    fStack_2b70 = auVar82._16_4_;
                                    fStack_2b6c = auVar82._20_4_;
                                    fStack_2b68 = auVar82._24_4_;
                                    auVar46._4_4_ = auVar182._4_4_ * (float)local_2b80._4_4_;
                                    auVar46._0_4_ = auVar182._0_4_ * (float)local_2b80._0_4_;
                                    auVar46._8_4_ = auVar182._8_4_ * fStack_2b78;
                                    auVar46._12_4_ = auVar182._12_4_ * fStack_2b74;
                                    auVar46._16_4_ = auVar182._16_4_ * fStack_2b70;
                                    auVar46._20_4_ = auVar182._20_4_ * fStack_2b6c;
                                    auVar46._24_4_ = auVar182._24_4_ * fStack_2b68;
                                    auVar46._28_4_ = auVar120._28_4_;
                                    auVar102 = vfmadd213ps_fma(local_2b60,auVar207,auVar46);
                                    auVar102 = vfmadd213ps_fma(local_2de0._0_32_,auVar183,
                                                               ZEXT1632(auVar102));
                                    fVar101 = auVar102._0_4_ + auVar102._0_4_;
                                    fVar129 = auVar102._4_4_ + auVar102._4_4_;
                                    fVar132 = auVar102._8_4_ + auVar102._8_4_;
                                    fVar135 = auVar102._12_4_ + auVar102._12_4_;
                                    auVar119 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(
                                                  fVar129,fVar101))));
                                    auVar150._0_4_ = auVar182._0_4_ * fVar140;
                                    auVar150._4_4_ = auVar182._4_4_ * fVar130;
                                    auVar150._8_4_ = auVar182._8_4_ * fVar133;
                                    auVar150._12_4_ = auVar182._12_4_ * fVar136;
                                    auVar150._16_4_ = auVar182._16_4_ * fVar188;
                                    auVar150._20_4_ = auVar182._20_4_ * fVar189;
                                    auVar150._24_4_ = auVar182._24_4_ * fVar190;
                                    auVar150._28_4_ = 0;
                                    auVar102 = vfmadd213ps_fma(_local_2d80,auVar207,auVar150);
                                    auVar141 = vfmadd213ps_fma(local_2ce0,auVar183,
                                                               ZEXT1632(auVar102));
                                    auVar120 = vrcpps_avx(auVar119);
                                    auVar186._8_4_ = 0x3f800000;
                                    auVar186._0_8_ = &DAT_3f8000003f800000;
                                    auVar186._12_4_ = 0x3f800000;
                                    auVar186._16_4_ = 0x3f800000;
                                    auVar186._20_4_ = 0x3f800000;
                                    auVar186._24_4_ = 0x3f800000;
                                    auVar186._28_4_ = 0x3f800000;
                                    auVar102 = vfnmadd213ps_fma(auVar120,auVar119,auVar186);
                                    auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar120,auVar120)
                                    ;
                                    auVar126 = ZEXT1632(CONCAT412((auVar141._12_4_ + auVar141._12_4_
                                                                  ) * auVar102._12_4_,
                                                                  CONCAT48((auVar141._8_4_ +
                                                                           auVar141._8_4_) *
                                                                           auVar102._8_4_,
                                                                           CONCAT44((auVar141._4_4_
                                                                                    + auVar141._4_4_
                                                                                    ) * auVar102.
                                                  _4_4_,(auVar141._0_4_ + auVar141._0_4_) *
                                                        auVar102._0_4_))));
                                    auVar120 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),
                                                          auVar126,2);
                                    auVar121 = vcmpps_avx(auVar126,*(undefined1 (*) [32])
                                                                    (ray + 0x100),2);
                                    auVar120 = vandps_avx(auVar120,auVar121);
                                    auVar161._0_8_ = CONCAT44(fVar129,fVar101) ^ 0x8000000080000000;
                                    auVar161._8_4_ = -fVar132;
                                    auVar161._12_4_ = -fVar135;
                                    auVar161._16_4_ = 0x80000000;
                                    auVar161._20_4_ = 0x80000000;
                                    auVar161._24_4_ = 0x80000000;
                                    auVar161._28_4_ = 0x80000000;
                                    auVar121 = vcmpps_avx(auVar119,auVar161,4);
                                    auVar120 = vandps_avx(auVar121,auVar120);
                                    auVar120 = vpslld_avx2(auVar120,0x1f);
                                    auVar121 = vpsrad_avx2(auVar120,0x1f);
                                    auVar120 = auVar145 & auVar121;
                                    auVar145 = vandps_avx(auVar121,auVar145);
                                    auVar197 = ZEXT3264(auVar145);
                                    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar120 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar120 >> 0x7f,0) == '\0') &&
                                          (auVar120 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar120 >> 0xbf,0) == '\0') &&
                                        (auVar120 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar120[0x1f])
                                    goto LAB_005cd086;
                                  }
                                  auVar224 = ZEXT3264(auVar126);
                                  auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                                                CONCAT424(0x7f800000,
                                                                          CONCAT420(0x7f800000,
                                                                                    CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                  auVar187 = ZEXT3264(auVar127);
                                  auVar145 = auVar197._0_32_;
                                  local_2f20._0_32_ = auVar172;
                                  _local_2b80 = auVar17;
                                  if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar145 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar145 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar145 >> 0x7f,0) == '\0') &&
                                        (auVar197 & (undefined1  [64])0x100000000) ==
                                        (undefined1  [64])0x0) && SUB321(auVar145 >> 0xbf,0) == '\0'
                                       ) && (auVar197 & (undefined1  [64])0x100000000) ==
                                            (undefined1  [64])0x0) && -1 < auVar197[0x1f]) {
                                    auVar197 = ZEXT3264(local_2f40);
                                    uVar93 = unaff_R14;
                                    auVar127 = auVar172;
                                  }
                                  else {
                                    auVar109._0_4_ =
                                         (float)(int)(*(ushort *)(lVar91 + 8 + lVar94) - 1);
                                    auVar109._4_12_ = auVar184._4_12_;
                                    auVar102 = vrcpss_avx(auVar109,auVar109);
                                    _local_2d80 = auVar145;
                                    auVar141 = vfnmadd213ss_fma(auVar109,auVar102,
                                                                SUB6416(ZEXT464(0x40000000),0));
                                    auVar158._0_4_ =
                                         (float)(int)(*(ushort *)(lVar91 + 10 + lVar94) - 1);
                                    auVar158._4_12_ = auVar184._4_12_;
                                    fVar140 = auVar102._0_4_ * auVar141._0_4_;
                                    fVar130 = (float)(int)(((uint)unaff_R14 & 1) + uVar84);
                                    auVar47._4_4_ =
                                         (auVar127._4_4_ + fVar130 * (float)local_2c80._4_4_) *
                                         fVar140;
                                    auVar47._0_4_ =
                                         (auVar127._0_4_ + fVar130 * (float)local_2c80._0_4_) *
                                         fVar140;
                                    auVar47._8_4_ =
                                         (auVar127._8_4_ + fVar130 * fStack_2c78) * fVar140;
                                    auVar47._12_4_ =
                                         (auVar127._12_4_ + fVar130 * fStack_2c74) * fVar140;
                                    auVar47._16_4_ =
                                         (auVar127._16_4_ + fVar130 * fStack_2c70) * fVar140;
                                    auVar47._20_4_ =
                                         (auVar127._20_4_ + fVar130 * fStack_2c6c) * fVar140;
                                    auVar47._24_4_ =
                                         (auVar127._24_4_ + fVar130 * fStack_2c68) * fVar140;
                                    auVar47._28_4_ = fVar140;
                                    auVar102 = vrcpss_avx(auVar158,auVar158);
                                    auVar127 = vblendvps_avx(auVar127,auVar47,auVar145);
                                    auVar187 = ZEXT3264(auVar127);
                                    auVar141 = vfnmadd213ss_fma(auVar158,auVar102,
                                                                SUB6416(ZEXT464(0x40000000),0));
                                    fVar130 = (float)(int)(((uint)(unaff_R14 >> 1) & 0x7fffffff) +
                                                          uVar87);
                                    fVar140 = auVar102._0_4_ * auVar141._0_4_;
                                    auVar48._4_4_ =
                                         (local_2f40._4_4_ + fVar130 * (float)local_2c80._4_4_) *
                                         fVar140;
                                    auVar48._0_4_ =
                                         (local_2f40._0_4_ + fVar130 * (float)local_2c80._0_4_) *
                                         fVar140;
                                    auVar48._8_4_ =
                                         (local_2f40._8_4_ + fVar130 * fStack_2c78) * fVar140;
                                    auVar48._12_4_ =
                                         (local_2f40._12_4_ + fVar130 * fStack_2c74) * fVar140;
                                    auVar48._16_4_ =
                                         (local_2f40._16_4_ + fVar130 * fStack_2c70) * fVar140;
                                    auVar48._20_4_ =
                                         (local_2f40._20_4_ + fVar130 * fStack_2c6c) * fVar140;
                                    auVar48._24_4_ =
                                         (local_2f40._24_4_ + fVar130 * fStack_2c68) * fVar140;
                                    auVar48._28_4_ = local_2f40._28_4_ + fVar130;
                                    local_2f40 = vblendvps_avx(local_2f40,auVar48,auVar145);
                                    auVar197 = ZEXT3264(local_2f40);
                                    local_2de0._0_8_ = unaff_R14;
                                    uVar7 = *(uint *)(local_2d30 + unaff_R14 * 4);
                                    pGVar8 = (context->scene->geometries).items[uVar7].ptr;
                                    uVar83 = pGVar8->mask;
                                    auVar122._4_4_ = uVar83;
                                    auVar122._0_4_ = uVar83;
                                    auVar122._8_4_ = uVar83;
                                    auVar122._12_4_ = uVar83;
                                    auVar122._16_4_ = uVar83;
                                    auVar122._20_4_ = uVar83;
                                    auVar122._24_4_ = uVar83;
                                    auVar122._28_4_ = uVar83;
                                    auVar120 = vpand_avx2(auVar122,*(undefined1 (*) [32])
                                                                    (ray + 0x120));
                                    auVar184 = vpcmpeqd_avx2(auVar120,_DAT_02020f00);
                                    auVar120 = auVar145 & ~auVar184;
                                    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar120 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar120 >> 0x7f,0) != '\0') ||
                                          (auVar120 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar120 >> 0xbf,0) != '\0') ||
                                        (auVar120 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar120[0x1f] < '\0') {
                                      uVar98 = *(undefined4 *)(local_2d40 + unaff_R14 * 4);
                                      auVar145 = vandnps_avx(auVar184,auVar145);
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar120 = vandps_avx(_local_2c80,local_2b00);
                                        auVar172 = vrcpps_avx(_local_2c80);
                                        auVar179._8_4_ = 0x3f800000;
                                        auVar179._0_8_ = &DAT_3f8000003f800000;
                                        auVar179._12_4_ = 0x3f800000;
                                        auVar179._16_4_ = 0x3f800000;
                                        auVar179._20_4_ = 0x3f800000;
                                        auVar179._24_4_ = 0x3f800000;
                                        auVar179._28_4_ = 0x3f800000;
                                        auVar102 = vfnmadd213ps_fma(auVar172,_local_2c80,auVar179);
                                        auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar172,
                                                                   auVar172);
                                        auVar164._8_4_ = 0x219392ef;
                                        auVar164._0_8_ = 0x219392ef219392ef;
                                        auVar164._12_4_ = 0x219392ef;
                                        auVar164._16_4_ = 0x219392ef;
                                        auVar164._20_4_ = 0x219392ef;
                                        auVar164._24_4_ = 0x219392ef;
                                        auVar164._28_4_ = 0x219392ef;
                                        auVar120 = vcmpps_avx(auVar120,auVar164,5);
                                        auVar120 = vandps_avx(auVar120,ZEXT1632(auVar102));
                                        auVar68._4_4_ = auVar127._4_4_ * auVar120._4_4_;
                                        auVar68._0_4_ = auVar127._0_4_ * auVar120._0_4_;
                                        auVar68._8_4_ = auVar127._8_4_ * auVar120._8_4_;
                                        auVar68._12_4_ = auVar127._12_4_ * auVar120._12_4_;
                                        auVar68._16_4_ = auVar127._16_4_ * auVar120._16_4_;
                                        auVar68._20_4_ = auVar127._20_4_ * auVar120._20_4_;
                                        auVar68._24_4_ = auVar127._24_4_ * auVar120._24_4_;
                                        auVar68._28_4_ = 0x219392ef;
                                        local_28c0 = vminps_avx(auVar68,auVar179);
                                        auVar69._4_4_ = local_2f40._4_4_ * auVar120._4_4_;
                                        auVar69._0_4_ = local_2f40._0_4_ * auVar120._0_4_;
                                        auVar69._8_4_ = local_2f40._8_4_ * auVar120._8_4_;
                                        auVar69._12_4_ = local_2f40._12_4_ * auVar120._12_4_;
                                        auVar69._16_4_ = local_2f40._16_4_ * auVar120._16_4_;
                                        auVar69._20_4_ = local_2f40._20_4_ * auVar120._20_4_;
                                        auVar69._24_4_ = local_2f40._24_4_ * auVar120._24_4_;
                                        auVar69._28_4_ = auVar120._28_4_;
                                        local_28a0 = vminps_avx(auVar69,auVar179);
                                        pRVar11 = context->user;
                                        local_2920[0] = (RTCHitN)auVar183[0];
                                        local_2920[1] = (RTCHitN)auVar183[1];
                                        local_2920[2] = (RTCHitN)auVar183[2];
                                        local_2920[3] = (RTCHitN)auVar183[3];
                                        local_2920[4] = (RTCHitN)auVar183[4];
                                        local_2920[5] = (RTCHitN)auVar183[5];
                                        local_2920[6] = (RTCHitN)auVar183[6];
                                        local_2920[7] = (RTCHitN)auVar183[7];
                                        local_2920[8] = (RTCHitN)auVar183[8];
                                        local_2920[9] = (RTCHitN)auVar183[9];
                                        local_2920[10] = (RTCHitN)auVar183[10];
                                        local_2920[0xb] = (RTCHitN)auVar183[0xb];
                                        local_2920[0xc] = (RTCHitN)auVar183[0xc];
                                        local_2920[0xd] = (RTCHitN)auVar183[0xd];
                                        local_2920[0xe] = (RTCHitN)auVar183[0xe];
                                        local_2920[0xf] = (RTCHitN)auVar183[0xf];
                                        local_2920[0x10] = (RTCHitN)auVar183[0x10];
                                        local_2920[0x11] = (RTCHitN)auVar183[0x11];
                                        local_2920[0x12] = (RTCHitN)auVar183[0x12];
                                        local_2920[0x13] = (RTCHitN)auVar183[0x13];
                                        local_2920[0x14] = (RTCHitN)auVar183[0x14];
                                        local_2920[0x15] = (RTCHitN)auVar183[0x15];
                                        local_2920[0x16] = (RTCHitN)auVar183[0x16];
                                        local_2920[0x17] = (RTCHitN)auVar183[0x17];
                                        local_2920[0x18] = (RTCHitN)auVar183[0x18];
                                        local_2920[0x19] = (RTCHitN)auVar183[0x19];
                                        local_2920[0x1a] = (RTCHitN)auVar183[0x1a];
                                        local_2920[0x1b] = (RTCHitN)auVar183[0x1b];
                                        local_2920[0x1c] = (RTCHitN)auVar183[0x1c];
                                        local_2920[0x1d] = (RTCHitN)auVar183[0x1d];
                                        local_2920[0x1e] = (RTCHitN)auVar183[0x1e];
                                        local_2920[0x1f] = (RTCHitN)auVar183[0x1f];
                                        local_2900 = auVar207;
                                        local_28e0 = auVar182;
                                        local_2880 = uVar98;
                                        uStack_287c = uVar98;
                                        uStack_2878 = uVar98;
                                        uStack_2874 = uVar98;
                                        uStack_2870 = uVar98;
                                        uStack_286c = uVar98;
                                        uStack_2868 = uVar98;
                                        uStack_2864 = uVar98;
                                        local_2860 = uVar7;
                                        uStack_285c = uVar7;
                                        uStack_2858 = uVar7;
                                        uStack_2854 = uVar7;
                                        uStack_2850 = uVar7;
                                        uStack_284c = uVar7;
                                        uStack_2848 = uVar7;
                                        uStack_2844 = uVar7;
                                        auVar120 = vpcmpeqd_avx2(local_28a0,local_28a0);
                                        local_2db8[1] = auVar120;
                                        *local_2db8 = auVar120;
                                        local_2840 = pRVar11->instID[0];
                                        uStack_283c = local_2840;
                                        uStack_2838 = local_2840;
                                        uStack_2834 = local_2840;
                                        uStack_2830 = local_2840;
                                        uStack_282c = local_2840;
                                        uStack_2828 = local_2840;
                                        uStack_2824 = local_2840;
                                        local_2820 = pRVar11->instPrimID[0];
                                        uStack_281c = local_2820;
                                        uStack_2818 = local_2820;
                                        uStack_2814 = local_2820;
                                        uStack_2810 = local_2820;
                                        uStack_280c = local_2820;
                                        uStack_2808 = local_2820;
                                        uStack_2804 = local_2820;
                                        auVar120 = *(undefined1 (*) [32])(ray + 0x100);
                                        auVar172 = vblendvps_avx(auVar120,auVar126,auVar145);
                                        *(undefined1 (*) [32])(ray + 0x100) = auVar172;
                                        local_2d60 = auVar145;
                                        local_2e50.geometryUserPtr = pGVar8->userPtr;
                                        local_2e50.valid = (int *)local_2d60;
                                        local_2e50.context = context->user;
                                        local_2e50.ray = (RTCRayN *)ray;
                                        local_2e50.hit = local_2920;
                                        local_2e50.N = 8;
                                        local_2ec0 = auVar182;
                                        local_2e80 = auVar183;
                                        local_2ea0 = auVar207;
                                        if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          local_2e00._0_4_ = uVar84;
                                          local_2e20._0_4_ = uVar87;
                                          local_2ee0 = auVar126;
                                          local_2da0 = auVar127;
                                          local_2ce0 = auVar209;
                                          local_2ca0 = auVar120;
                                          (*pGVar8->occlusionFilterN)(&local_2e50);
                                          auVar224 = ZEXT3264(local_2ee0);
                                          auVar211 = ZEXT3264(local_2ce0);
                                          auVar197 = ZEXT3264(local_2f40);
                                          auVar187 = ZEXT3264(local_2da0);
                                          auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                                                        CONCAT424(0x7f800000,
                                                                                  CONCAT420(
                                                  0x7f800000,
                                                  CONCAT416(0x7f800000,
                                                            CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                                  ))));
                                          lVar91 = local_2ee8;
                                          lVar94 = local_2f48;
                                          ray = local_2f58;
                                          context = local_2f50;
                                          uVar87 = local_2e20._0_4_;
                                          auVar120 = local_2ca0;
                                          uVar84 = local_2e00._0_4_;
                                        }
                                        auVar145 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),
                                                                 local_2d60);
                                        auVar127 = _DAT_0205a980 & ~auVar145;
                                        auVar207 = local_2ea0;
                                        auVar182 = local_2ec0;
                                        auVar183 = local_2e80;
                                        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar127 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar127 >> 0x5f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               SUB321(auVar127 >> 0x7f,0) == '\0') &&
                                              (auVar127 & (undefined1  [32])0x100000000) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar127 >> 0xbf,0) == '\0') &&
                                            (auVar127 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar127[0x1f]) {
                                          auVar145 = auVar145 ^ _DAT_0205a980;
                                        }
                                        else {
                                          p_Var10 = context->args->filter;
                                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                            local_2e00._0_4_ = uVar84;
                                            local_2e20._0_4_ = uVar87;
                                            local_2da0 = auVar187._0_32_;
                                            local_2f40 = auVar197._0_32_;
                                            local_2ce0 = auVar211._0_32_;
                                            local_2ee0 = auVar224._0_32_;
                                            local_2ca0 = auVar120;
                                            (*p_Var10)(&local_2e50);
                                            auVar224 = ZEXT3264(local_2ee0);
                                            auVar211 = ZEXT3264(local_2ce0);
                                            auVar197 = ZEXT3264(local_2f40);
                                            auVar187 = ZEXT3264(local_2da0);
                                            auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                                                          CONCAT424(0x7f800000,
                                                                                    CONCAT420(
                                                  0x7f800000,
                                                  CONCAT416(0x7f800000,
                                                            CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                                  ))));
                                            lVar94 = local_2f48;
                                            ray = local_2f58;
                                            context = local_2f50;
                                            uVar87 = local_2e20._0_4_;
                                            auVar120 = local_2ca0;
                                            auVar182 = local_2ec0;
                                            auVar183 = local_2e80;
                                            auVar207 = local_2ea0;
                                            uVar84 = local_2e00._0_4_;
                                          }
                                          auVar127 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1
                                                                                      [16])0x0),0),
                                                                   local_2d60);
                                          auVar145 = auVar127 ^ _DAT_0205a980;
                                          auVar166._8_4_ = 0xff800000;
                                          auVar166._0_8_ = 0xff800000ff800000;
                                          auVar166._12_4_ = 0xff800000;
                                          auVar166._16_4_ = 0xff800000;
                                          auVar166._20_4_ = 0xff800000;
                                          auVar166._24_4_ = 0xff800000;
                                          auVar166._28_4_ = 0xff800000;
                                          auVar127 = vblendvps_avx(auVar166,*(undefined1 (*) [32])
                                                                             (local_2e50.ray + 0x100
                                                                             ),auVar127);
                                          *(undefined1 (*) [32])(local_2e50.ray + 0x100) = auVar127;
                                        }
                                        auVar127 = vblendvps_avx(auVar120,*(undefined1 (*) [32])
                                                                           local_2ef0,auVar145);
                                        *(undefined1 (*) [32])local_2ef0 = auVar127;
                                      }
                                      auVar172 = vandnps_avx(auVar145,local_2f20._0_32_);
                                    }
                                    auVar127 = vandnps_avx(_local_2d80,local_2f20._0_32_);
                                    uVar93 = local_2de0._0_8_;
                                  }
                                  auVar214 = ZEXT3264(auVar172);
                                  auVar145 = auVar187._0_32_;
                                  auVar120 = auVar197._0_32_;
                                  if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar127 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar127 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar127 >> 0x7f,0) == '\0') &&
                                        (auVar127 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar127 >> 0xbf,0) == '\0'
                                       ) && (auVar127 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar127[0x1f]) {
                                    _local_2d00 = auVar145;
                                    _local_2d20 = auVar120;
                                    local_2cc0 = _local_2c80;
                                    local_2ec0 = auVar182;
                                    local_2e80 = auVar183;
                                    local_2ea0 = auVar207;
                                  }
                                  else {
                                    local_2da0 = auVar145;
                                    auVar127 = *(undefined1 (*) [32])ray;
                                    auVar184 = *(undefined1 (*) [32])(ray + 0x20);
                                    auVar121 = *(undefined1 (*) [32])(ray + 0x40);
                                    auVar81._4_4_ = uStack_267c;
                                    auVar81._0_4_ = local_2680;
                                    auVar81._8_4_ = uStack_2678;
                                    auVar81._12_4_ = uStack_2674;
                                    auVar81._16_4_ = uStack_2670;
                                    auVar81._20_4_ = uStack_266c;
                                    auVar81._24_4_ = uStack_2668;
                                    auVar81._28_4_ = uStack_2664;
                                    local_2e20 = vsubps_avx(auVar81,auVar127);
                                    auVar80._4_4_ = uStack_269c;
                                    auVar80._0_4_ = local_26a0;
                                    auVar80._8_4_ = uStack_2698;
                                    auVar80._12_4_ = uStack_2694;
                                    auVar80._16_4_ = uStack_2690;
                                    auVar80._20_4_ = uStack_268c;
                                    auVar80._24_4_ = uStack_2688;
                                    auVar80._28_4_ = uStack_2684;
                                    local_2ca0 = vsubps_avx(auVar80,auVar184);
                                    auVar79._4_4_ = uStack_26bc;
                                    auVar79._0_4_ = local_26c0;
                                    auVar79._8_4_ = uStack_26b8;
                                    auVar79._12_4_ = uStack_26b4;
                                    auVar79._16_4_ = uStack_26b0;
                                    auVar79._20_4_ = uStack_26ac;
                                    auVar79._24_4_ = uStack_26a8;
                                    auVar79._28_4_ = uStack_26a4;
                                    local_2b40 = vsubps_avx(auVar79,auVar121);
                                    local_2e00 = vsubps_avx(local_2ba0,auVar127);
                                    auVar126 = vsubps_avx(local_2bc0,auVar184);
                                    auVar119 = vsubps_avx(local_2be0,auVar121);
                                    auVar16 = vsubps_avx(local_2c00,auVar127);
                                    auVar184 = vsubps_avx(local_2640,auVar184);
                                    auVar121 = vsubps_avx(local_2660,auVar121);
                                    local_2b60 = vsubps_avx(auVar16,local_2e20);
                                    local_2ba0 = vsubps_avx(auVar184,local_2ca0);
                                    _local_2b80 = vsubps_avx(auVar121,local_2b40);
                                    auVar193._0_4_ = auVar16._0_4_ + local_2e20._0_4_;
                                    auVar193._4_4_ = auVar16._4_4_ + local_2e20._4_4_;
                                    auVar193._8_4_ = auVar16._8_4_ + local_2e20._8_4_;
                                    auVar193._12_4_ = auVar16._12_4_ + local_2e20._12_4_;
                                    auVar193._16_4_ = auVar16._16_4_ + local_2e20._16_4_;
                                    auVar193._20_4_ = auVar16._20_4_ + local_2e20._20_4_;
                                    auVar193._24_4_ = auVar16._24_4_ + local_2e20._24_4_;
                                    auVar193._28_4_ = auVar16._28_4_ + local_2e20._28_4_;
                                    local_2ce0 = auVar211._0_32_;
                                    auVar26 = local_2ce0;
                                    auVar200._0_4_ = local_2ca0._0_4_ + auVar184._0_4_;
                                    auVar200._4_4_ = local_2ca0._4_4_ + auVar184._4_4_;
                                    auVar200._8_4_ = local_2ca0._8_4_ + auVar184._8_4_;
                                    auVar200._12_4_ = local_2ca0._12_4_ + auVar184._12_4_;
                                    auVar200._16_4_ = local_2ca0._16_4_ + auVar184._16_4_;
                                    auVar200._20_4_ = local_2ca0._20_4_ + auVar184._20_4_;
                                    auVar200._24_4_ = local_2ca0._24_4_ + auVar184._24_4_;
                                    auVar200._28_4_ = local_2ca0._28_4_ + auVar184._28_4_;
                                    fVar191 = local_2b40._0_4_;
                                    auVar210._0_4_ = fVar191 + auVar121._0_4_;
                                    fVar199 = local_2b40._4_4_;
                                    auVar210._4_4_ = fVar199 + auVar121._4_4_;
                                    fVar201 = local_2b40._8_4_;
                                    auVar210._8_4_ = fVar201 + auVar121._8_4_;
                                    fVar202 = local_2b40._12_4_;
                                    auVar210._12_4_ = fVar202 + auVar121._12_4_;
                                    fVar203 = local_2b40._16_4_;
                                    auVar210._16_4_ = fVar203 + auVar121._16_4_;
                                    fVar204 = local_2b40._20_4_;
                                    auVar210._20_4_ = fVar204 + auVar121._20_4_;
                                    fVar205 = local_2b40._24_4_;
                                    auVar210._24_4_ = fVar205 + auVar121._24_4_;
                                    fVar140 = auVar121._28_4_;
                                    auVar210._28_4_ = local_2b40._28_4_ + fVar140;
                                    auVar197._0_4_ = auVar200._0_4_ * local_2b80._0_4_;
                                    auVar197._4_4_ = auVar200._4_4_ * local_2b80._4_4_;
                                    auVar197._8_4_ = auVar200._8_4_ * local_2b80._8_4_;
                                    auVar197._12_4_ = auVar200._12_4_ * local_2b80._12_4_;
                                    auVar197._16_4_ = auVar200._16_4_ * local_2b80._16_4_;
                                    auVar197._20_4_ = auVar200._20_4_ * local_2b80._20_4_;
                                    auVar197._28_36_ = auVar213._28_36_;
                                    auVar197._24_4_ = auVar200._24_4_ * local_2b80._24_4_;
                                    auVar141 = vfmsub231ps_fma(auVar197._0_32_,local_2ba0,auVar210);
                                    auVar49._4_4_ = auVar210._4_4_ * local_2b60._4_4_;
                                    auVar49._0_4_ = auVar210._0_4_ * local_2b60._0_4_;
                                    auVar49._8_4_ = auVar210._8_4_ * local_2b60._8_4_;
                                    auVar49._12_4_ = auVar210._12_4_ * local_2b60._12_4_;
                                    auVar49._16_4_ = auVar210._16_4_ * local_2b60._16_4_;
                                    auVar49._20_4_ = auVar210._20_4_ * local_2b60._20_4_;
                                    auVar49._24_4_ = auVar210._24_4_ * local_2b60._24_4_;
                                    auVar49._28_4_ = auVar210._28_4_;
                                    auVar102 = vfmsub231ps_fma(auVar49,_local_2b80,auVar193);
                                    auVar50._4_4_ = auVar193._4_4_ * local_2ba0._4_4_;
                                    auVar50._0_4_ = auVar193._0_4_ * local_2ba0._0_4_;
                                    auVar50._8_4_ = auVar193._8_4_ * local_2ba0._8_4_;
                                    auVar50._12_4_ = auVar193._12_4_ * local_2ba0._12_4_;
                                    auVar50._16_4_ = auVar193._16_4_ * local_2ba0._16_4_;
                                    auVar50._20_4_ = auVar193._20_4_ * local_2ba0._20_4_;
                                    auVar50._24_4_ = auVar193._24_4_ * local_2ba0._24_4_;
                                    auVar50._28_4_ = auVar193._28_4_;
                                    auVar103 = vfmsub231ps_fma(auVar50,local_2b60,auVar200);
                                    pRVar1 = ray + 0xc0;
                                    fVar128 = *(float *)pRVar1;
                                    fVar131 = *(float *)(ray + 0xc4);
                                    fVar134 = *(float *)(ray + 200);
                                    fVar137 = *(float *)(ray + 0xcc);
                                    fVar138 = *(float *)(ray + 0xd0);
                                    fVar139 = *(float *)(ray + 0xd4);
                                    fVar72 = *(float *)(ray + 0xd8);
                                    auVar82 = *(undefined1 (*) [28])pRVar1;
                                    auVar51._4_4_ = fVar131 * auVar103._4_4_;
                                    auVar51._0_4_ = fVar128 * auVar103._0_4_;
                                    auVar51._8_4_ = fVar134 * auVar103._8_4_;
                                    auVar51._12_4_ = fVar137 * auVar103._12_4_;
                                    auVar51._16_4_ = fVar138 * 0.0;
                                    auVar51._20_4_ = fVar139 * 0.0;
                                    auVar51._24_4_ = fVar72 * 0.0;
                                    auVar51._28_4_ = fVar140;
                                    local_2de0._0_32_ = *(undefined1 (*) [32])(ray + 0xa0);
                                    auVar102 = vfmadd231ps_fma(auVar51,local_2de0._0_32_,
                                                               ZEXT1632(auVar102));
                                    auVar127 = *(undefined1 (*) [32])(ray + 0x80);
                                    auVar213 = ZEXT3264(auVar127);
                                    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar127,
                                                               ZEXT1632(auVar141));
                                    auVar187 = ZEXT1664(auVar102);
                                    local_2bc0 = vsubps_avx(local_2ca0,auVar126);
                                    local_2c00 = vsubps_avx(local_2b40,auVar119);
                                    auVar223._0_4_ = local_2ca0._0_4_ + auVar126._0_4_;
                                    auVar223._4_4_ = local_2ca0._4_4_ + auVar126._4_4_;
                                    auVar223._8_4_ = local_2ca0._8_4_ + auVar126._8_4_;
                                    auVar223._12_4_ = local_2ca0._12_4_ + auVar126._12_4_;
                                    auVar223._16_4_ = local_2ca0._16_4_ + auVar126._16_4_;
                                    auVar223._20_4_ = local_2ca0._20_4_ + auVar126._20_4_;
                                    auVar223._24_4_ = local_2ca0._24_4_ + auVar126._24_4_;
                                    auVar223._28_4_ = local_2ca0._28_4_ + auVar126._28_4_;
                                    auVar123._0_4_ = fVar191 + auVar119._0_4_;
                                    auVar123._4_4_ = fVar199 + auVar119._4_4_;
                                    auVar123._8_4_ = fVar201 + auVar119._8_4_;
                                    auVar123._12_4_ = fVar202 + auVar119._12_4_;
                                    auVar123._16_4_ = fVar203 + auVar119._16_4_;
                                    auVar123._20_4_ = fVar204 + auVar119._20_4_;
                                    auVar123._24_4_ = fVar205 + auVar119._24_4_;
                                    auVar123._28_4_ = local_2b40._28_4_ + auVar119._28_4_;
                                    fVar130 = local_2c00._0_4_;
                                    fVar136 = local_2c00._4_4_;
                                    auVar52._4_4_ = auVar223._4_4_ * fVar136;
                                    auVar52._0_4_ = auVar223._0_4_ * fVar130;
                                    fVar189 = local_2c00._8_4_;
                                    auVar52._8_4_ = auVar223._8_4_ * fVar189;
                                    fVar101 = local_2c00._12_4_;
                                    auVar52._12_4_ = auVar223._12_4_ * fVar101;
                                    fVar132 = local_2c00._16_4_;
                                    auVar52._16_4_ = auVar223._16_4_ * fVar132;
                                    fVar12 = local_2c00._20_4_;
                                    auVar52._20_4_ = auVar223._20_4_ * fVar12;
                                    fVar14 = local_2c00._24_4_;
                                    auVar52._24_4_ = auVar223._24_4_ * fVar14;
                                    auVar52._28_4_ = local_2b80._28_4_;
                                    auVar103 = vfmsub231ps_fma(auVar52,local_2bc0,auVar123);
                                    local_2be0 = vsubps_avx(local_2e20,local_2e00);
                                    fVar206 = local_2be0._0_4_;
                                    fVar215 = local_2be0._4_4_;
                                    auVar53._4_4_ = fVar215 * auVar123._4_4_;
                                    auVar53._0_4_ = fVar206 * auVar123._0_4_;
                                    fVar216 = local_2be0._8_4_;
                                    auVar53._8_4_ = fVar216 * auVar123._8_4_;
                                    fVar217 = local_2be0._12_4_;
                                    auVar53._12_4_ = fVar217 * auVar123._12_4_;
                                    fVar218 = local_2be0._16_4_;
                                    auVar53._16_4_ = fVar218 * auVar123._16_4_;
                                    fVar219 = local_2be0._20_4_;
                                    auVar53._20_4_ = fVar219 * auVar123._20_4_;
                                    fVar220 = local_2be0._24_4_;
                                    auVar53._24_4_ = fVar220 * auVar123._24_4_;
                                    auVar53._28_4_ = auVar123._28_4_;
                                    auVar176._0_4_ = local_2e00._0_4_ + local_2e20._0_4_;
                                    auVar176._4_4_ = local_2e00._4_4_ + local_2e20._4_4_;
                                    auVar176._8_4_ = local_2e00._8_4_ + local_2e20._8_4_;
                                    auVar176._12_4_ = local_2e00._12_4_ + local_2e20._12_4_;
                                    auVar176._16_4_ = local_2e00._16_4_ + local_2e20._16_4_;
                                    auVar176._20_4_ = local_2e00._20_4_ + local_2e20._20_4_;
                                    auVar176._24_4_ = local_2e00._24_4_ + local_2e20._24_4_;
                                    auVar176._28_4_ = local_2e00._28_4_ + local_2e20._28_4_;
                                    auVar141 = vfmsub231ps_fma(auVar53,local_2c00,auVar176);
                                    fVar133 = local_2bc0._0_4_;
                                    fVar188 = local_2bc0._4_4_;
                                    auVar54._4_4_ = auVar176._4_4_ * fVar188;
                                    auVar54._0_4_ = auVar176._0_4_ * fVar133;
                                    fVar190 = local_2bc0._8_4_;
                                    auVar54._8_4_ = auVar176._8_4_ * fVar190;
                                    fVar129 = local_2bc0._12_4_;
                                    auVar54._12_4_ = auVar176._12_4_ * fVar129;
                                    fVar135 = local_2bc0._16_4_;
                                    auVar54._16_4_ = auVar176._16_4_ * fVar135;
                                    fVar13 = local_2bc0._20_4_;
                                    auVar54._20_4_ = auVar176._20_4_ * fVar13;
                                    fVar15 = local_2bc0._24_4_;
                                    auVar54._24_4_ = auVar176._24_4_ * fVar15;
                                    auVar54._28_4_ = auVar176._28_4_;
                                    auVar104 = vfmsub231ps_fma(auVar54,local_2be0,auVar223);
                                    auVar177._0_4_ = fVar128 * auVar104._0_4_;
                                    auVar177._4_4_ = fVar131 * auVar104._4_4_;
                                    auVar177._8_4_ = fVar134 * auVar104._8_4_;
                                    auVar177._12_4_ = fVar137 * auVar104._12_4_;
                                    auVar177._16_4_ = fVar138 * 0.0;
                                    auVar177._20_4_ = fVar139 * 0.0;
                                    auVar177._24_4_ = fVar72 * 0.0;
                                    auVar177._28_4_ = 0;
                                    auVar141 = vfmadd231ps_fma(auVar177,local_2de0._0_32_,
                                                               ZEXT1632(auVar141));
                                    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar127,
                                                               ZEXT1632(auVar103));
                                    auVar18 = vsubps_avx(local_2e00,auVar16);
                                    auVar124._0_4_ = local_2e00._0_4_ + auVar16._0_4_;
                                    auVar124._4_4_ = local_2e00._4_4_ + auVar16._4_4_;
                                    auVar124._8_4_ = local_2e00._8_4_ + auVar16._8_4_;
                                    auVar124._12_4_ = local_2e00._12_4_ + auVar16._12_4_;
                                    auVar124._16_4_ = local_2e00._16_4_ + auVar16._16_4_;
                                    auVar124._20_4_ = local_2e00._20_4_ + auVar16._20_4_;
                                    auVar124._24_4_ = local_2e00._24_4_ + auVar16._24_4_;
                                    auVar124._28_4_ = local_2e00._28_4_ + auVar16._28_4_;
                                    auVar16 = vsubps_avx(auVar126,auVar184);
                                    auVar151._0_4_ = auVar126._0_4_ + auVar184._0_4_;
                                    auVar151._4_4_ = auVar126._4_4_ + auVar184._4_4_;
                                    auVar151._8_4_ = auVar126._8_4_ + auVar184._8_4_;
                                    auVar151._12_4_ = auVar126._12_4_ + auVar184._12_4_;
                                    auVar151._16_4_ = auVar126._16_4_ + auVar184._16_4_;
                                    auVar151._20_4_ = auVar126._20_4_ + auVar184._20_4_;
                                    auVar151._24_4_ = auVar126._24_4_ + auVar184._24_4_;
                                    auVar151._28_4_ = auVar126._28_4_ + auVar184._28_4_;
                                    auVar17 = vsubps_avx(auVar119,auVar121);
                                    auVar162._0_4_ = auVar119._0_4_ + auVar121._0_4_;
                                    auVar162._4_4_ = auVar119._4_4_ + auVar121._4_4_;
                                    auVar162._8_4_ = auVar119._8_4_ + auVar121._8_4_;
                                    auVar162._12_4_ = auVar119._12_4_ + auVar121._12_4_;
                                    auVar162._16_4_ = auVar119._16_4_ + auVar121._16_4_;
                                    auVar162._20_4_ = auVar119._20_4_ + auVar121._20_4_;
                                    auVar162._24_4_ = auVar119._24_4_ + auVar121._24_4_;
                                    auVar162._28_4_ = auVar119._28_4_ + fVar140;
                                    auVar55._4_4_ = auVar17._4_4_ * auVar151._4_4_;
                                    auVar55._0_4_ = auVar17._0_4_ * auVar151._0_4_;
                                    auVar55._8_4_ = auVar17._8_4_ * auVar151._8_4_;
                                    auVar55._12_4_ = auVar17._12_4_ * auVar151._12_4_;
                                    auVar55._16_4_ = auVar17._16_4_ * auVar151._16_4_;
                                    auVar55._20_4_ = auVar17._20_4_ * auVar151._20_4_;
                                    auVar55._24_4_ = auVar17._24_4_ * auVar151._24_4_;
                                    auVar55._28_4_ = local_2bc0._28_4_;
                                    auVar104 = vfmsub231ps_fma(auVar55,auVar16,auVar162);
                                    auVar56._4_4_ = auVar18._4_4_ * auVar162._4_4_;
                                    auVar56._0_4_ = auVar18._0_4_ * auVar162._0_4_;
                                    auVar56._8_4_ = auVar18._8_4_ * auVar162._8_4_;
                                    auVar56._12_4_ = auVar18._12_4_ * auVar162._12_4_;
                                    auVar56._16_4_ = auVar18._16_4_ * auVar162._16_4_;
                                    auVar56._20_4_ = auVar18._20_4_ * auVar162._20_4_;
                                    auVar56._24_4_ = auVar18._24_4_ * auVar162._24_4_;
                                    auVar56._28_4_ = auVar162._28_4_;
                                    auVar103 = vfmsub231ps_fma(auVar56,auVar17,auVar124);
                                    auVar57._4_4_ = auVar16._4_4_ * auVar124._4_4_;
                                    auVar57._0_4_ = auVar16._0_4_ * auVar124._0_4_;
                                    auVar57._8_4_ = auVar16._8_4_ * auVar124._8_4_;
                                    auVar57._12_4_ = auVar16._12_4_ * auVar124._12_4_;
                                    auVar57._16_4_ = auVar16._16_4_ * auVar124._16_4_;
                                    auVar57._20_4_ = auVar16._20_4_ * auVar124._20_4_;
                                    auVar57._24_4_ = auVar16._24_4_ * auVar124._24_4_;
                                    auVar57._28_4_ = auVar124._28_4_;
                                    auVar105 = vfmsub231ps_fma(auVar57,auVar18,auVar151);
                                    _local_2d80 = *(undefined1 (*) [32])pRVar1;
                                    auVar25 = _local_2d80;
                                    auVar125._0_4_ = fVar128 * auVar105._0_4_;
                                    auVar125._4_4_ = fVar131 * auVar105._4_4_;
                                    auVar125._8_4_ = fVar134 * auVar105._8_4_;
                                    auVar125._12_4_ = fVar137 * auVar105._12_4_;
                                    auVar125._16_4_ = fVar138 * 0.0;
                                    auVar125._20_4_ = fVar139 * 0.0;
                                    auVar125._24_4_ = fVar72 * 0.0;
                                    auVar125._28_4_ = 0;
                                    auVar103 = vfmadd231ps_fma(auVar125,local_2de0._0_32_,
                                                               ZEXT1632(auVar103));
                                    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar127,
                                                               ZEXT1632(auVar104));
                                    local_2cc0 = ZEXT1632(CONCAT412(auVar103._12_4_ +
                                                                    auVar102._12_4_ +
                                                                    auVar141._12_4_,
                                                                    CONCAT48(auVar103._8_4_ +
                                                                             auVar102._8_4_ +
                                                                             auVar141._8_4_,
                                                                             CONCAT44(auVar103._4_4_
                                                                                      + auVar102.
                                                  _4_4_ + auVar141._4_4_,
                                                  auVar103._0_4_ + auVar102._0_4_ + auVar141._0_4_))
                                                  ));
                                    auVar197 = ZEXT3264(local_2b00);
                                    auVar184 = vandps_avx(local_2cc0,local_2b00);
                                    fVar140 = auVar184._0_4_ * 1.1920929e-07;
                                    fVar128 = auVar184._4_4_ * 1.1920929e-07;
                                    auVar58._4_4_ = fVar128;
                                    auVar58._0_4_ = fVar140;
                                    fVar131 = auVar184._8_4_ * 1.1920929e-07;
                                    auVar58._8_4_ = fVar131;
                                    fVar134 = auVar184._12_4_ * 1.1920929e-07;
                                    auVar58._12_4_ = fVar134;
                                    fVar137 = auVar184._16_4_ * 1.1920929e-07;
                                    auVar58._16_4_ = fVar137;
                                    fVar138 = auVar184._20_4_ * 1.1920929e-07;
                                    auVar58._20_4_ = fVar138;
                                    fVar139 = auVar184._24_4_ * 1.1920929e-07;
                                    auVar58._24_4_ = fVar139;
                                    auVar58._28_4_ = auVar184._28_4_;
                                    _local_2d00 = ZEXT1632(auVar102);
                                    auVar121 = vminps_avx(_local_2d00,ZEXT1632(auVar141));
                                    auVar121 = vminps_avx(auVar121,ZEXT1632(auVar103));
                                    local_2ce0._0_4_ = auVar211._0_4_;
                                    local_2ce0._4_4_ = auVar211._4_4_;
                                    local_2ce0._8_4_ = auVar211._8_4_;
                                    local_2ce0._12_4_ = auVar211._12_4_;
                                    local_2ce0._16_4_ = auVar211._16_4_;
                                    local_2ce0._20_4_ = auVar211._20_4_;
                                    local_2ce0._24_4_ = auVar211._24_4_;
                                    local_2ce0._28_4_ = auVar211._28_4_;
                                    auVar171._0_4_ = (uint)fVar140 ^ local_2ce0._0_4_;
                                    auVar171._4_4_ = (uint)fVar128 ^ local_2ce0._4_4_;
                                    auVar171._8_4_ = (uint)fVar131 ^ local_2ce0._8_4_;
                                    auVar171._12_4_ = (uint)fVar134 ^ local_2ce0._12_4_;
                                    auVar171._16_4_ = (uint)fVar137 ^ local_2ce0._16_4_;
                                    auVar171._20_4_ = (uint)fVar138 ^ local_2ce0._20_4_;
                                    auVar171._24_4_ = (uint)fVar139 ^ local_2ce0._24_4_;
                                    auVar171._28_4_ = auVar184._28_4_ ^ local_2ce0._28_4_;
                                    auVar121 = vcmpps_avx(auVar121,auVar171,5);
                                    _local_2d20 = ZEXT1632(auVar141);
                                    auVar126 = vmaxps_avx(_local_2d00,ZEXT1632(auVar141));
                                    auVar184 = vmaxps_avx(auVar126,ZEXT1632(auVar103));
                                    auVar184 = vcmpps_avx(auVar184,auVar58,2);
                                    auVar119 = vorps_avx(auVar121,auVar184);
                                    auVar19 = auVar172 & auVar119;
                                    auVar184 = vandps_avx(auVar119,auVar172);
                                    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar19 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar19 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar19 >> 0x7f,0) == '\0') &&
                                          (auVar19 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar19 >> 0xbf,0) == '\0') &&
                                        (auVar19 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar19[0x1f]) {
                                      auVar214 = ZEXT3264(auVar184);
LAB_005cd333:
                                      local_2cc0 = _local_2c80;
                                      auVar211 = auVar213;
                                      local_2ea0 = auVar207;
                                      local_2ec0 = auVar182;
                                      local_2ee0 = auVar224._0_32_;
                                      local_2e80 = auVar183;
                                      _local_2d20 = auVar120;
                                      _local_2d00 = auVar145;
                                    }
                                    else {
                                      auVar213 = ZEXT3264(local_2bc0);
                                      auVar59._4_4_ = fVar188 * local_2b80._4_4_;
                                      auVar59._0_4_ = fVar133 * local_2b80._0_4_;
                                      auVar59._8_4_ = fVar190 * local_2b80._8_4_;
                                      auVar59._12_4_ = fVar129 * local_2b80._12_4_;
                                      auVar59._16_4_ = fVar135 * local_2b80._16_4_;
                                      auVar59._20_4_ = fVar13 * local_2b80._20_4_;
                                      auVar59._24_4_ = fVar15 * local_2b80._24_4_;
                                      auVar59._28_4_ = auVar119._28_4_;
                                      auVar60._4_4_ = fVar215 * local_2ba0._4_4_;
                                      auVar60._0_4_ = fVar206 * local_2ba0._0_4_;
                                      auVar60._8_4_ = fVar216 * local_2ba0._8_4_;
                                      auVar60._12_4_ = fVar217 * local_2ba0._12_4_;
                                      auVar60._16_4_ = fVar218 * local_2ba0._16_4_;
                                      auVar60._20_4_ = fVar219 * local_2ba0._20_4_;
                                      auVar60._24_4_ = fVar220 * local_2ba0._24_4_;
                                      auVar60._28_4_ = auVar172._28_4_;
                                      auVar102 = vfmsub213ps_fma(local_2ba0,local_2c00,auVar59);
                                      auVar61._4_4_ = auVar16._4_4_ * fVar136;
                                      auVar61._0_4_ = auVar16._0_4_ * fVar130;
                                      auVar61._8_4_ = auVar16._8_4_ * fVar189;
                                      auVar61._12_4_ = auVar16._12_4_ * fVar101;
                                      auVar61._16_4_ = auVar16._16_4_ * fVar132;
                                      auVar61._20_4_ = auVar16._20_4_ * fVar12;
                                      auVar61._24_4_ = auVar16._24_4_ * fVar14;
                                      auVar61._28_4_ = auVar121._28_4_;
                                      auVar62._4_4_ = fVar215 * auVar17._4_4_;
                                      auVar62._0_4_ = fVar206 * auVar17._0_4_;
                                      auVar62._8_4_ = fVar216 * auVar17._8_4_;
                                      auVar62._12_4_ = fVar217 * auVar17._12_4_;
                                      auVar62._16_4_ = fVar218 * auVar17._16_4_;
                                      auVar62._20_4_ = fVar219 * auVar17._20_4_;
                                      auVar62._24_4_ = fVar220 * auVar17._24_4_;
                                      auVar62._28_4_ = auVar126._28_4_;
                                      auVar141 = vfmsub213ps_fma(auVar17,local_2bc0,auVar61);
                                      auVar121 = vandps_avx(auVar59,local_2b00);
                                      auVar126 = vandps_avx(auVar61,local_2b00);
                                      auVar121 = vcmpps_avx(auVar121,auVar126,1);
                                      local_2e80 = vblendvps_avx(ZEXT1632(auVar141),
                                                                 ZEXT1632(auVar102),auVar121);
                                      auVar63._4_4_ = auVar18._4_4_ * fVar188;
                                      auVar63._0_4_ = auVar18._0_4_ * fVar133;
                                      auVar63._8_4_ = auVar18._8_4_ * fVar190;
                                      auVar63._12_4_ = auVar18._12_4_ * fVar129;
                                      auVar63._16_4_ = auVar18._16_4_ * fVar135;
                                      auVar63._20_4_ = auVar18._20_4_ * fVar13;
                                      auVar63._24_4_ = auVar18._24_4_ * fVar15;
                                      auVar63._28_4_ = auVar121._28_4_;
                                      auVar102 = vfmsub213ps_fma(auVar18,local_2c00,auVar62);
                                      auVar64._4_4_ = fVar136 * local_2b60._4_4_;
                                      auVar64._0_4_ = fVar130 * local_2b60._0_4_;
                                      auVar64._8_4_ = fVar189 * local_2b60._8_4_;
                                      auVar64._12_4_ = fVar101 * local_2b60._12_4_;
                                      auVar64._16_4_ = fVar132 * local_2b60._16_4_;
                                      auVar64._20_4_ = fVar12 * local_2b60._20_4_;
                                      auVar64._24_4_ = fVar14 * local_2b60._24_4_;
                                      auVar64._28_4_ = auVar126._28_4_;
                                      auVar141 = vfmsub213ps_fma(_local_2b80,local_2be0,auVar64);
                                      auVar187 = ZEXT1664(auVar141);
                                      auVar121 = vandps_avx(auVar64,local_2b00);
                                      auVar126 = vandps_avx(auVar62,local_2b00);
                                      auVar121 = vcmpps_avx(auVar121,auVar126,1);
                                      local_2ea0 = vblendvps_avx(ZEXT1632(auVar102),
                                                                 ZEXT1632(auVar141),auVar121);
                                      auVar102 = vfmsub213ps_fma(local_2b60,local_2bc0,auVar60);
                                      auVar141 = vfmsub213ps_fma(auVar16,local_2be0,auVar63);
                                      auVar121 = vandps_avx(auVar60,local_2b00);
                                      auVar126 = vandps_avx(auVar63,local_2b00);
                                      auVar121 = vcmpps_avx(auVar121,auVar126,1);
                                      local_2ec0 = vblendvps_avx(ZEXT1632(auVar141),
                                                                 ZEXT1632(auVar102),auVar121);
                                      local_2d80._0_4_ = auVar82._0_4_;
                                      local_2d80._4_4_ = auVar82._4_4_;
                                      fStack_2d78 = auVar82._8_4_;
                                      fStack_2d74 = auVar82._12_4_;
                                      fStack_2d70 = auVar82._16_4_;
                                      fStack_2d6c = auVar82._20_4_;
                                      fStack_2d68 = auVar82._24_4_;
                                      auVar65._4_4_ = local_2ec0._4_4_ * (float)local_2d80._4_4_;
                                      auVar65._0_4_ = local_2ec0._0_4_ * (float)local_2d80._0_4_;
                                      auVar65._8_4_ = local_2ec0._8_4_ * fStack_2d78;
                                      auVar65._12_4_ = local_2ec0._12_4_ * fStack_2d74;
                                      auVar65._16_4_ = local_2ec0._16_4_ * fStack_2d70;
                                      auVar65._20_4_ = local_2ec0._20_4_ * fStack_2d6c;
                                      auVar65._24_4_ = local_2ec0._24_4_ * fStack_2d68;
                                      auVar65._28_4_ = auVar121._28_4_;
                                      auVar102 = vfmadd213ps_fma(local_2de0._0_32_,local_2ea0,
                                                                 auVar65);
                                      auVar102 = vfmadd213ps_fma(auVar127,local_2e80,
                                                                 ZEXT1632(auVar102));
                                      fVar140 = auVar102._0_4_ + auVar102._0_4_;
                                      fVar130 = auVar102._4_4_ + auVar102._4_4_;
                                      fVar133 = auVar102._8_4_ + auVar102._8_4_;
                                      fVar136 = auVar102._12_4_ + auVar102._12_4_;
                                      auVar126 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar133,
                                                  CONCAT44(fVar130,fVar140))));
                                      auVar152._0_4_ = local_2ec0._0_4_ * fVar191;
                                      auVar152._4_4_ = local_2ec0._4_4_ * fVar199;
                                      auVar152._8_4_ = local_2ec0._8_4_ * fVar201;
                                      auVar152._12_4_ = local_2ec0._12_4_ * fVar202;
                                      auVar152._16_4_ = local_2ec0._16_4_ * fVar203;
                                      auVar152._20_4_ = local_2ec0._20_4_ * fVar204;
                                      auVar152._24_4_ = local_2ec0._24_4_ * fVar205;
                                      auVar152._28_4_ = 0;
                                      auVar102 = vfmadd213ps_fma(local_2ca0,local_2ea0,auVar152);
                                      auVar141 = vfmadd213ps_fma(local_2e20,local_2e80,
                                                                 ZEXT1632(auVar102));
                                      auVar127 = vrcpps_avx(auVar126);
                                      auVar178._8_4_ = 0x3f800000;
                                      auVar178._0_8_ = &DAT_3f8000003f800000;
                                      auVar178._12_4_ = 0x3f800000;
                                      auVar178._16_4_ = 0x3f800000;
                                      auVar178._20_4_ = 0x3f800000;
                                      auVar178._24_4_ = 0x3f800000;
                                      auVar178._28_4_ = 0x3f800000;
                                      auVar102 = vfnmadd213ps_fma(auVar127,auVar126,auVar178);
                                      auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar127,
                                                                 auVar127);
                                      local_2ee0 = ZEXT1632(CONCAT412((auVar141._12_4_ +
                                                                      auVar141._12_4_) *
                                                                      auVar102._12_4_,
                                                                      CONCAT48((auVar141._8_4_ +
                                                                               auVar141._8_4_) *
                                                                               auVar102._8_4_,
                                                                               CONCAT44((auVar141.
                                                  _4_4_ + auVar141._4_4_) * auVar102._4_4_,
                                                  (auVar141._0_4_ + auVar141._0_4_) * auVar102._0_4_
                                                  ))));
                                      auVar127 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),
                                                            local_2ee0,2);
                                      auVar121 = vcmpps_avx(local_2ee0,
                                                            *(undefined1 (*) [32])(ray + 0x100),2);
                                      auVar127 = vandps_avx(auVar127,auVar121);
                                      auVar163._0_4_ = (uint)fVar140 ^ local_2ce0._0_4_;
                                      auVar163._4_4_ = (uint)fVar130 ^ local_2ce0._4_4_;
                                      auVar163._8_4_ = (uint)fVar133 ^ local_2ce0._8_4_;
                                      auVar163._12_4_ = (uint)fVar136 ^ local_2ce0._12_4_;
                                      auVar163._16_4_ = local_2ce0._16_4_;
                                      auVar163._20_4_ = local_2ce0._20_4_;
                                      auVar163._24_4_ = local_2ce0._24_4_;
                                      auVar163._28_4_ = local_2ce0._28_4_;
                                      auVar121 = vcmpps_avx(auVar126,auVar163,4);
                                      auVar127 = vandps_avx(auVar121,auVar127);
                                      auVar127 = vpslld_avx2(auVar127,0x1f);
                                      auVar127 = vpsrad_avx2(auVar127,0x1f);
                                      auVar121 = auVar184 & auVar127;
                                      auVar127 = vandps_avx(auVar127,auVar184);
                                      auVar214 = ZEXT3264(auVar127);
                                      auVar211 = auVar213;
                                      if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar121 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar121 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar121 >> 0x7f,0) == '\0') &&
                                            (auVar121 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar121 >> 0xbf,0) == '\0') &&
                                          (auVar121 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar121[0x1f])
                                      goto LAB_005cd333;
                                    }
                                    auVar224 = ZEXT3264(local_2ee0);
                                    auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                                                  CONCAT424(0x7f800000,
                                                                            CONCAT420(0x7f800000,
                                                                                      CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                    auVar127 = auVar214._0_32_;
                                    local_2f20._0_32_ = auVar172;
                                    _local_2d80 = auVar25;
                                    local_2ce0 = auVar26;
                                    if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar127 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar127 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar127 >> 0x7f,0) != '\0') ||
                                          (auVar214 & (undefined1  [64])0x100000000) !=
                                          (undefined1  [64])0x0) ||
                                         SUB321(auVar127 >> 0xbf,0) != '\0') ||
                                        (auVar214 & (undefined1  [64])0x100000000) !=
                                        (undefined1  [64])0x0) || auVar214[0x1f] < '\0') {
                                      auVar145 = vsubps_avx(local_2cc0,_local_2d00);
                                      auVar120 = vsubps_avx(local_2cc0,_local_2d20);
                                      auVar169._0_4_ =
                                           (float)(int)(*(ushort *)(lVar91 + 8 + lVar94) - 1);
                                      auVar169._4_12_ = auVar211._4_12_;
                                      auVar102 = vrcpss_avx(auVar169,auVar169);
                                      auVar181._0_4_ =
                                           (float)(int)(*(ushort *)(lVar91 + 10 + lVar94) - 1);
                                      auVar181._4_12_ = auVar211._4_12_;
                                      auVar141 = vfnmadd213ss_fma(auVar169,auVar102,
                                                                  SUB6416(ZEXT464(0x40000000),0));
                                      fVar140 = auVar102._0_4_ * auVar141._0_4_;
                                      auVar102 = vrcpss_avx(auVar181,auVar181);
                                      auVar141 = vfnmadd213ss_fma(auVar181,auVar102,
                                                                  SUB6416(ZEXT464(0x40000000),0));
                                      fVar130 = auVar102._0_4_ * auVar141._0_4_;
                                      fVar133 = (float)(int)(((uint)uVar93 & 1) + uVar84);
                                      fVar136 = auVar145._0_4_ + local_2cc0._0_4_ * fVar133;
                                      fVar188 = auVar145._4_4_ + local_2cc0._4_4_ * fVar133;
                                      fVar189 = auVar145._8_4_ + local_2cc0._8_4_ * fVar133;
                                      fVar190 = auVar145._12_4_ + local_2cc0._12_4_ * fVar133;
                                      fVar101 = auVar145._16_4_ + local_2cc0._16_4_ * fVar133;
                                      fVar129 = auVar145._20_4_ + local_2cc0._20_4_ * fVar133;
                                      fVar132 = auVar145._24_4_ + local_2cc0._24_4_ * fVar133;
                                      auVar187 = ZEXT3264(CONCAT428(auVar145._28_4_ + fVar133,
                                                                    CONCAT424(fVar132,CONCAT420(
                                                  fVar129,CONCAT416(fVar101,CONCAT412(fVar190,
                                                  CONCAT48(fVar189,CONCAT44(fVar188,fVar136))))))));
                                      auVar66._4_4_ = fVar188 * fVar140;
                                      auVar66._0_4_ = fVar136 * fVar140;
                                      auVar66._8_4_ = fVar189 * fVar140;
                                      auVar66._12_4_ = fVar190 * fVar140;
                                      auVar66._16_4_ = fVar101 * fVar140;
                                      auVar66._20_4_ = fVar129 * fVar140;
                                      auVar66._24_4_ = fVar132 * fVar140;
                                      auVar66._28_4_ = fVar140;
                                      _local_2d00 = vblendvps_avx(auVar145,auVar66,auVar127);
                                      auVar183 = _local_2d00;
                                      fVar140 = (float)(int)(((uint)(uVar93 >> 1) & 0x7fffffff) +
                                                            uVar87);
                                      auVar67._4_4_ =
                                           (auVar120._4_4_ + local_2cc0._4_4_ * fVar140) * fVar130;
                                      auVar67._0_4_ =
                                           (auVar120._0_4_ + local_2cc0._0_4_ * fVar140) * fVar130;
                                      auVar67._8_4_ =
                                           (auVar120._8_4_ + local_2cc0._8_4_ * fVar140) * fVar130;
                                      auVar67._12_4_ =
                                           (auVar120._12_4_ + local_2cc0._12_4_ * fVar140) * fVar130
                                      ;
                                      auVar67._16_4_ =
                                           (auVar120._16_4_ + local_2cc0._16_4_ * fVar140) * fVar130
                                      ;
                                      auVar67._20_4_ =
                                           (auVar120._20_4_ + local_2cc0._20_4_ * fVar140) * fVar130
                                      ;
                                      auVar67._24_4_ =
                                           (auVar120._24_4_ + local_2cc0._24_4_ * fVar140) * fVar130
                                      ;
                                      auVar67._28_4_ = auVar120._28_4_ + fVar140;
                                      _local_2d20 = vblendvps_avx(auVar120,auVar67,auVar127);
                                      auVar182 = _local_2d20;
                                      uVar7 = *(uint *)(local_2d30 + uVar93 * 4);
                                      pGVar8 = (context->scene->geometries).items[uVar7].ptr;
                                      uVar83 = pGVar8->mask;
                                      auVar153._4_4_ = uVar83;
                                      auVar153._0_4_ = uVar83;
                                      auVar153._8_4_ = uVar83;
                                      auVar153._12_4_ = uVar83;
                                      auVar153._16_4_ = uVar83;
                                      auVar153._20_4_ = uVar83;
                                      auVar153._24_4_ = uVar83;
                                      auVar153._28_4_ = uVar83;
                                      auVar145 = vpand_avx2(auVar153,*(undefined1 (*) [32])
                                                                      (ray + 0x120));
                                      auVar120 = vpcmpeqd_avx2(auVar145,_DAT_02020f00);
                                      auVar145 = auVar127 & ~auVar120;
                                      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar145 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar145 >> 0x5f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             SUB321(auVar145 >> 0x7f,0) != '\0') ||
                                            (auVar145 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar145 >> 0xbf,0) != '\0') ||
                                          (auVar145 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar145[0x1f] < '\0') {
                                        local_2de0._0_8_ = uVar93;
                                        uVar98 = *(undefined4 *)(local_2d40 + uVar93 * 4);
                                        auVar127 = vandnps_avx(auVar120,auVar127);
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar187 = ZEXT3264(local_2cc0);
                                          auVar145 = vandps_avx(local_2cc0,local_2b00);
                                          auVar120 = vrcpps_avx(local_2cc0);
                                          auVar180._8_4_ = 0x3f800000;
                                          auVar180._0_8_ = &DAT_3f8000003f800000;
                                          auVar180._12_4_ = 0x3f800000;
                                          auVar180._16_4_ = 0x3f800000;
                                          auVar180._20_4_ = 0x3f800000;
                                          auVar180._24_4_ = 0x3f800000;
                                          auVar180._28_4_ = 0x3f800000;
                                          auVar102 = vfnmadd213ps_fma(auVar120,local_2cc0,auVar180);
                                          auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar120,
                                                                     auVar120);
                                          auVar165._8_4_ = 0x219392ef;
                                          auVar165._0_8_ = 0x219392ef219392ef;
                                          auVar165._12_4_ = 0x219392ef;
                                          auVar165._16_4_ = 0x219392ef;
                                          auVar165._20_4_ = 0x219392ef;
                                          auVar165._24_4_ = 0x219392ef;
                                          auVar165._28_4_ = 0x219392ef;
                                          auVar145 = vcmpps_avx(auVar145,auVar165,5);
                                          auVar145 = vandps_avx(auVar145,ZEXT1632(auVar102));
                                          auVar70._4_4_ = auVar145._4_4_ * (float)local_2d00._4_4_;
                                          auVar70._0_4_ = auVar145._0_4_ * (float)local_2d00._0_4_;
                                          auVar70._8_4_ = auVar145._8_4_ * fStack_2cf8;
                                          auVar70._12_4_ = auVar145._12_4_ * fStack_2cf4;
                                          auVar70._16_4_ = auVar145._16_4_ * fStack_2cf0;
                                          auVar70._20_4_ = auVar145._20_4_ * fStack_2cec;
                                          auVar70._24_4_ = auVar145._24_4_ * fStack_2ce8;
                                          auVar70._28_4_ = 0x219392ef;
                                          local_28c0 = vminps_avx(auVar70,auVar180);
                                          auVar71._4_4_ = auVar145._4_4_ * (float)local_2d20._4_4_;
                                          auVar71._0_4_ = auVar145._0_4_ * (float)local_2d20._0_4_;
                                          auVar71._8_4_ = auVar145._8_4_ * fStack_2d18;
                                          auVar71._12_4_ = auVar145._12_4_ * fStack_2d14;
                                          auVar71._16_4_ = auVar145._16_4_ * fStack_2d10;
                                          auVar71._20_4_ = auVar145._20_4_ * fStack_2d0c;
                                          auVar71._24_4_ = auVar145._24_4_ * fStack_2d08;
                                          auVar71._28_4_ = auVar145._28_4_;
                                          local_28a0 = vminps_avx(auVar71,auVar180);
                                          pRVar11 = context->user;
                                          local_2920[0] = (RTCHitN)local_2e80[0];
                                          local_2920[1] = (RTCHitN)local_2e80[1];
                                          local_2920[2] = (RTCHitN)local_2e80[2];
                                          local_2920[3] = (RTCHitN)local_2e80[3];
                                          local_2920[4] = (RTCHitN)local_2e80[4];
                                          local_2920[5] = (RTCHitN)local_2e80[5];
                                          local_2920[6] = (RTCHitN)local_2e80[6];
                                          local_2920[7] = (RTCHitN)local_2e80[7];
                                          local_2920[8] = (RTCHitN)local_2e80[8];
                                          local_2920[9] = (RTCHitN)local_2e80[9];
                                          local_2920[10] = (RTCHitN)local_2e80[10];
                                          local_2920[0xb] = (RTCHitN)local_2e80[0xb];
                                          local_2920[0xc] = (RTCHitN)local_2e80[0xc];
                                          local_2920[0xd] = (RTCHitN)local_2e80[0xd];
                                          local_2920[0xe] = (RTCHitN)local_2e80[0xe];
                                          local_2920[0xf] = (RTCHitN)local_2e80[0xf];
                                          local_2920[0x10] = (RTCHitN)local_2e80[0x10];
                                          local_2920[0x11] = (RTCHitN)local_2e80[0x11];
                                          local_2920[0x12] = (RTCHitN)local_2e80[0x12];
                                          local_2920[0x13] = (RTCHitN)local_2e80[0x13];
                                          local_2920[0x14] = (RTCHitN)local_2e80[0x14];
                                          local_2920[0x15] = (RTCHitN)local_2e80[0x15];
                                          local_2920[0x16] = (RTCHitN)local_2e80[0x16];
                                          local_2920[0x17] = (RTCHitN)local_2e80[0x17];
                                          local_2920[0x18] = (RTCHitN)local_2e80[0x18];
                                          local_2920[0x19] = (RTCHitN)local_2e80[0x19];
                                          local_2920[0x1a] = (RTCHitN)local_2e80[0x1a];
                                          local_2920[0x1b] = (RTCHitN)local_2e80[0x1b];
                                          local_2920[0x1c] = (RTCHitN)local_2e80[0x1c];
                                          local_2920[0x1d] = (RTCHitN)local_2e80[0x1d];
                                          local_2920[0x1e] = (RTCHitN)local_2e80[0x1e];
                                          local_2920[0x1f] = (RTCHitN)local_2e80[0x1f];
                                          local_2900 = local_2ea0;
                                          local_28e0 = local_2ec0;
                                          local_2880 = uVar98;
                                          uStack_287c = uVar98;
                                          uStack_2878 = uVar98;
                                          uStack_2874 = uVar98;
                                          uStack_2870 = uVar98;
                                          uStack_286c = uVar98;
                                          uStack_2868 = uVar98;
                                          uStack_2864 = uVar98;
                                          local_2860 = uVar7;
                                          uStack_285c = uVar7;
                                          uStack_2858 = uVar7;
                                          uStack_2854 = uVar7;
                                          uStack_2850 = uVar7;
                                          uStack_284c = uVar7;
                                          uStack_2848 = uVar7;
                                          uStack_2844 = uVar7;
                                          auVar145 = vpcmpeqd_avx2(local_28a0,local_28a0);
                                          local_2db8[1] = auVar145;
                                          *local_2db8 = auVar145;
                                          local_2840 = pRVar11->instID[0];
                                          uStack_283c = local_2840;
                                          uStack_2838 = local_2840;
                                          uStack_2834 = local_2840;
                                          uStack_2830 = local_2840;
                                          uStack_282c = local_2840;
                                          uStack_2828 = local_2840;
                                          uStack_2824 = local_2840;
                                          local_2820 = pRVar11->instPrimID[0];
                                          uStack_281c = local_2820;
                                          uStack_2818 = local_2820;
                                          uStack_2814 = local_2820;
                                          uStack_2810 = local_2820;
                                          uStack_280c = local_2820;
                                          uStack_2808 = local_2820;
                                          uStack_2804 = local_2820;
                                          local_2f40 = *(undefined1 (*) [32])(ray + 0x100);
                                          auVar145 = vblendvps_avx(local_2f40,local_2ee0,auVar127);
                                          *(undefined1 (*) [32])(ray + 0x100) = auVar145;
                                          local_2d60 = auVar127;
                                          local_2e50.geometryUserPtr = pGVar8->userPtr;
                                          local_2e50.valid = (int *)local_2d60;
                                          local_2e50.context = context->user;
                                          local_2e50.ray = (RTCRayN *)ray;
                                          local_2e50.hit = local_2920;
                                          local_2e50.N = 8;
                                          _local_2d20 = auVar182;
                                          _local_2d00 = auVar183;
                                          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                            local_2e00._0_4_ = uVar84;
                                            local_2e20._0_4_ = uVar87;
                                            auVar187 = ZEXT1664(local_2cc0._0_16_);
                                            auVar197 = ZEXT1664(local_2b00._0_16_);
                                            auVar211 = ZEXT1664(auVar211._0_16_);
                                            (*pGVar8->occlusionFilterN)(&local_2e50);
                                            auVar224 = ZEXT3264(local_2ee0);
                                            auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                                                          CONCAT424(0x7f800000,
                                                                                    CONCAT420(
                                                  0x7f800000,
                                                  CONCAT416(0x7f800000,
                                                            CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                                  ))));
                                            lVar91 = local_2ee8;
                                            lVar94 = local_2f48;
                                            ray = local_2f58;
                                            context = local_2f50;
                                            uVar87 = local_2e20._0_4_;
                                            uVar84 = local_2e00._0_4_;
                                          }
                                          auVar127 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),
                                                                   local_2d60);
                                          auVar145 = _DAT_0205a980 & ~auVar127;
                                          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0 &&
                                                   (auVar145 >> 0x3f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar145 >> 0x5f & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 SUB321(auVar145 >> 0x7f,0) == '\0') &&
                                                (auVar145 & (undefined1  [32])0x100000000) ==
                                                (undefined1  [32])0x0) &&
                                               SUB321(auVar145 >> 0xbf,0) == '\0') &&
                                              (auVar145 & (undefined1  [32])0x100000000) ==
                                              (undefined1  [32])0x0) && -1 < auVar145[0x1f]) {
                                            auVar127 = auVar127 ^ _DAT_0205a980;
                                          }
                                          else {
                                            p_Var10 = context->args->filter;
                                            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                              local_2ee0 = auVar224._0_32_;
                                              local_2e00._0_4_ = uVar84;
                                              local_2e20._0_4_ = uVar87;
                                              auVar187 = ZEXT1664(auVar187._0_16_);
                                              auVar197 = ZEXT1664(auVar197._0_16_);
                                              auVar211 = ZEXT1664(auVar211._0_16_);
                                              (*p_Var10)(&local_2e50);
                                              auVar224 = ZEXT3264(local_2ee0);
                                              auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                                                            CONCAT424(0x7f800000,
                                                                                      CONCAT420(
                                                  0x7f800000,
                                                  CONCAT416(0x7f800000,
                                                            CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                                  ))));
                                              lVar94 = local_2f48;
                                              ray = local_2f58;
                                              context = local_2f50;
                                              uVar87 = local_2e20._0_4_;
                                              uVar84 = local_2e00._0_4_;
                                            }
                                            auVar145 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1
                                                                                        [16])0x0),0)
                                                                     ,local_2d60);
                                            auVar127 = auVar145 ^ _DAT_0205a980;
                                            auVar167._8_4_ = 0xff800000;
                                            auVar167._0_8_ = 0xff800000ff800000;
                                            auVar167._12_4_ = 0xff800000;
                                            auVar167._16_4_ = 0xff800000;
                                            auVar167._20_4_ = 0xff800000;
                                            auVar167._24_4_ = 0xff800000;
                                            auVar167._28_4_ = 0xff800000;
                                            auVar145 = vblendvps_avx(auVar167,*(undefined1 (*) [32])
                                                                               (local_2e50.ray +
                                                                               0x100),auVar145);
                                            *(undefined1 (*) [32])(local_2e50.ray + 0x100) =
                                                 auVar145;
                                          }
                                          auVar145 = vblendvps_avx(local_2f40,
                                                                   *(undefined1 (*) [32])local_2ef0,
                                                                   auVar127);
                                          *(undefined1 (*) [32])local_2ef0 = auVar145;
                                          uVar93 = local_2de0._0_8_;
                                        }
                                        auVar127 = vandnps_avx(auVar127,local_2f20._0_32_);
                                        auVar214 = ZEXT3264(auVar127);
                                        goto LAB_005cd03d;
                                      }
                                    }
                                    auVar214 = ZEXT3264(auVar172);
                                  }
LAB_005cd03d:
                                  local_2ee0 = auVar224._0_32_;
                                  auVar127 = auVar214._0_32_;
                                  unaff_R14 = uVar93;
                                  if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar127 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar127 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar127 >> 0x7f,0) == '\0') &&
                                        (auVar214 & (undefined1  [64])0x100000000) ==
                                        (undefined1  [64])0x0) && SUB321(auVar127 >> 0xbf,0) == '\0'
                                       ) && (auVar214 & (undefined1  [64])0x100000000) ==
                                            (undefined1  [64])0x0) && -1 < auVar214[0x1f]) break;
                                  unaff_R14 = uVar93 + 1;
                                  puVar90 = puVar90 + 8;
                                } while (uVar93 < 3);
                                auVar145 = local_26e0 & auVar127;
                                bVar100 = (((((((auVar145 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar145 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar145 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar145 >> 0x7f,0) == '\0') &&
                                            (auVar145 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar145 >> 0xbf,0) == '\0') &&
                                          (auVar145 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar145[0x1f];
                                auVar127 = vandps_avx(auVar127,local_26e0);
                                auVar224 = ZEXT3264(auVar127);
                                lVar88 = local_2c30;
                                uVar92 = local_2c28;
                                uVar93 = local_2da8;
                              }
                            } while ((!bVar100) && (uVar92 = uVar92 - 1 & uVar92, uVar92 != 0));
                          }
                          lVar88 = local_2c38 + 1;
                        } while (lVar88 != local_2c40);
                        auVar119._0_8_ = auVar224._0_8_ ^ 0xffffffffffffffff;
                        auVar119._8_4_ = auVar224._8_4_ ^ 0xffffffff;
                        auVar119._12_4_ = auVar224._12_4_ ^ 0xffffffff;
                        auVar119._16_4_ = auVar224._16_4_ ^ 0xffffffff;
                        auVar119._20_4_ = auVar224._20_4_ ^ 0xffffffff;
                        auVar119._24_4_ = auVar224._24_4_ ^ 0xffffffff;
                        auVar119._28_4_ = auVar224._28_4_ ^ 0xffffffff;
                      }
                      local_2c20 = vorps_avx(auVar119,local_2c20);
                      auVar127 = _DAT_0205a980 & ~local_2c20;
                      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar127 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar127 >> 0x7f,0) == '\0') &&
                            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar127 >> 0xbf,0) == '\0') &&
                          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar127[0x1f]) goto LAB_005cd8d8;
                      auVar168._8_4_ = 0xff800000;
                      auVar168._0_8_ = 0xff800000ff800000;
                      auVar168._12_4_ = 0xff800000;
                      auVar168._16_4_ = 0xff800000;
                      auVar168._20_4_ = 0xff800000;
                      auVar168._24_4_ = 0xff800000;
                      auVar168._28_4_ = 0xff800000;
                      local_2940 = vblendvps_avx(local_2940,auVar168,local_2c20);
                      iVar85 = 0;
                      break;
                    }
                    goto LAB_005cd8e9;
                  }
                  auVar224 = ZEXT3264(auVar213._0_32_);
                  uVar97 = 0;
                  uVar92 = 8;
                  do {
                    uVar86 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar97 * 8);
                    if (uVar86 != 8) {
                      uVar98 = *(undefined4 *)(root.ptr + 0x20 + uVar97 * 4);
                      auVar110._4_4_ = uVar98;
                      auVar110._0_4_ = uVar98;
                      auVar110._8_4_ = uVar98;
                      auVar110._12_4_ = uVar98;
                      auVar110._16_4_ = uVar98;
                      auVar110._20_4_ = uVar98;
                      auVar110._24_4_ = uVar98;
                      auVar110._28_4_ = uVar98;
                      auVar73._8_8_ = local_2ae0._8_8_;
                      auVar73._0_8_ = local_2ae0._0_8_;
                      auVar73._16_8_ = local_2ae0._16_8_;
                      auVar73._24_8_ = local_2ae0._24_8_;
                      auVar75._8_8_ = local_2ae0._40_8_;
                      auVar75._0_8_ = local_2ae0._32_8_;
                      auVar75._16_8_ = local_2ae0._48_8_;
                      auVar75._24_8_ = local_2ae0._56_8_;
                      auVar77._8_8_ = local_2ae0._72_8_;
                      auVar77._0_8_ = local_2ae0._64_8_;
                      auVar77._16_8_ = local_2ae0._80_8_;
                      auVar77._24_8_ = local_2ae0._88_8_;
                      auVar127 = vsubps_avx(auVar110,auVar73);
                      auVar214._0_4_ = (float)local_2a20._0_4_ * auVar127._0_4_;
                      auVar214._4_4_ = (float)local_2a20._4_4_ * auVar127._4_4_;
                      auVar214._8_4_ = fStack_2a18 * auVar127._8_4_;
                      auVar214._12_4_ = fStack_2a14 * auVar127._12_4_;
                      auVar214._16_4_ = fStack_2a10 * auVar127._16_4_;
                      auVar214._20_4_ = fStack_2a0c * auVar127._20_4_;
                      auVar214._28_36_ = auVar187._28_36_;
                      auVar214._24_4_ = fStack_2a08 * auVar127._24_4_;
                      auVar120 = auVar214._0_32_;
                      auVar187 = ZEXT3264(auVar120);
                      uVar98 = *(undefined4 *)(root.ptr + 0x40 + uVar97 * 4);
                      auVar111._4_4_ = uVar98;
                      auVar111._0_4_ = uVar98;
                      auVar111._8_4_ = uVar98;
                      auVar111._12_4_ = uVar98;
                      auVar111._16_4_ = uVar98;
                      auVar111._20_4_ = uVar98;
                      auVar111._24_4_ = uVar98;
                      auVar111._28_4_ = uVar98;
                      auVar127 = vsubps_avx(auVar111,auVar75);
                      auVar198._0_4_ = (float)local_2a00._0_4_ * auVar127._0_4_;
                      auVar198._4_4_ = (float)local_2a00._4_4_ * auVar127._4_4_;
                      auVar198._8_4_ = fStack_29f8 * auVar127._8_4_;
                      auVar198._12_4_ = fStack_29f4 * auVar127._12_4_;
                      auVar198._16_4_ = fStack_29f0 * auVar127._16_4_;
                      auVar198._20_4_ = fStack_29ec * auVar127._20_4_;
                      auVar198._28_36_ = auVar197._28_36_;
                      auVar198._24_4_ = fStack_29e8 * auVar127._24_4_;
                      auVar172 = auVar198._0_32_;
                      auVar197 = ZEXT3264(auVar172);
                      uVar98 = *(undefined4 *)(root.ptr + 0x60 + uVar97 * 4);
                      auVar112._4_4_ = uVar98;
                      auVar112._0_4_ = uVar98;
                      auVar112._8_4_ = uVar98;
                      auVar112._12_4_ = uVar98;
                      auVar112._16_4_ = uVar98;
                      auVar112._20_4_ = uVar98;
                      auVar112._24_4_ = uVar98;
                      auVar112._28_4_ = uVar98;
                      auVar127 = vsubps_avx(auVar112,auVar77);
                      auVar212._0_4_ = (float)local_29e0._0_4_ * auVar127._0_4_;
                      auVar212._4_4_ = (float)local_29e0._4_4_ * auVar127._4_4_;
                      auVar212._8_4_ = fStack_29d8 * auVar127._8_4_;
                      auVar212._12_4_ = fStack_29d4 * auVar127._12_4_;
                      auVar212._16_4_ = fStack_29d0 * auVar127._16_4_;
                      auVar212._20_4_ = fStack_29cc * auVar127._20_4_;
                      auVar212._28_36_ = auVar211._28_36_;
                      auVar212._24_4_ = fStack_29c8 * auVar127._24_4_;
                      auVar182 = auVar212._0_32_;
                      auVar211 = ZEXT3264(auVar182);
                      uVar98 = *(undefined4 *)(root.ptr + 0x30 + uVar97 * 4);
                      auVar113._4_4_ = uVar98;
                      auVar113._0_4_ = uVar98;
                      auVar113._8_4_ = uVar98;
                      auVar113._12_4_ = uVar98;
                      auVar113._16_4_ = uVar98;
                      auVar113._20_4_ = uVar98;
                      auVar113._24_4_ = uVar98;
                      auVar113._28_4_ = uVar98;
                      auVar127 = vsubps_avx(auVar113,auVar73);
                      auVar20._4_4_ = (float)local_2a20._4_4_ * auVar127._4_4_;
                      auVar20._0_4_ = (float)local_2a20._0_4_ * auVar127._0_4_;
                      auVar20._8_4_ = fStack_2a18 * auVar127._8_4_;
                      auVar20._12_4_ = fStack_2a14 * auVar127._12_4_;
                      auVar20._16_4_ = fStack_2a10 * auVar127._16_4_;
                      auVar20._20_4_ = fStack_2a0c * auVar127._20_4_;
                      auVar20._24_4_ = fStack_2a08 * auVar127._24_4_;
                      auVar20._28_4_ = (int)((ulong)local_2ae0._24_8_ >> 0x20);
                      uVar98 = *(undefined4 *)(root.ptr + 0x50 + uVar97 * 4);
                      auVar114._4_4_ = uVar98;
                      auVar114._0_4_ = uVar98;
                      auVar114._8_4_ = uVar98;
                      auVar114._12_4_ = uVar98;
                      auVar114._16_4_ = uVar98;
                      auVar114._20_4_ = uVar98;
                      auVar114._24_4_ = uVar98;
                      auVar114._28_4_ = uVar98;
                      auVar127 = vsubps_avx(auVar114,auVar75);
                      auVar21._4_4_ = (float)local_2a00._4_4_ * auVar127._4_4_;
                      auVar21._0_4_ = (float)local_2a00._0_4_ * auVar127._0_4_;
                      auVar21._8_4_ = fStack_29f8 * auVar127._8_4_;
                      auVar21._12_4_ = fStack_29f4 * auVar127._12_4_;
                      auVar21._16_4_ = fStack_29f0 * auVar127._16_4_;
                      auVar21._20_4_ = fStack_29ec * auVar127._20_4_;
                      auVar21._24_4_ = fStack_29e8 * auVar127._24_4_;
                      auVar21._28_4_ = (int)((ulong)local_2ae0._56_8_ >> 0x20);
                      uVar98 = *(undefined4 *)(root.ptr + 0x70 + uVar97 * 4);
                      auVar115._4_4_ = uVar98;
                      auVar115._0_4_ = uVar98;
                      auVar115._8_4_ = uVar98;
                      auVar115._12_4_ = uVar98;
                      auVar115._16_4_ = uVar98;
                      auVar115._20_4_ = uVar98;
                      auVar115._24_4_ = uVar98;
                      auVar115._28_4_ = uVar98;
                      auVar127 = vsubps_avx(auVar115,auVar77);
                      auVar22._4_4_ = (float)local_29e0._4_4_ * auVar127._4_4_;
                      auVar22._0_4_ = (float)local_29e0._0_4_ * auVar127._0_4_;
                      auVar22._8_4_ = fStack_29d8 * auVar127._8_4_;
                      auVar22._12_4_ = fStack_29d4 * auVar127._12_4_;
                      auVar22._16_4_ = fStack_29d0 * auVar127._16_4_;
                      auVar22._20_4_ = fStack_29cc * auVar127._20_4_;
                      auVar22._24_4_ = fStack_29c8 * auVar127._24_4_;
                      auVar22._28_4_ = (int)((ulong)local_2ae0._88_8_ >> 0x20);
                      auVar127 = vminps_avx(auVar120,auVar20);
                      auVar145 = vminps_avx(auVar172,auVar21);
                      auVar127 = vmaxps_avx(auVar127,auVar145);
                      auVar145 = vminps_avx(auVar182,auVar22);
                      auVar127 = vmaxps_avx(auVar127,auVar145);
                      auVar23._4_4_ = auVar127._4_4_ * 0.99999964;
                      auVar23._0_4_ = auVar127._0_4_ * 0.99999964;
                      auVar23._8_4_ = auVar127._8_4_ * 0.99999964;
                      auVar23._12_4_ = auVar127._12_4_ * 0.99999964;
                      auVar23._16_4_ = auVar127._16_4_ * 0.99999964;
                      auVar23._20_4_ = auVar127._20_4_ * 0.99999964;
                      auVar23._24_4_ = auVar127._24_4_ * 0.99999964;
                      auVar23._28_4_ = auVar127._28_4_;
                      auVar127 = vmaxps_avx(auVar120,auVar20);
                      auVar145 = vmaxps_avx(auVar172,auVar21);
                      auVar145 = vminps_avx(auVar127,auVar145);
                      auVar127 = vmaxps_avx(auVar182,auVar22);
                      auVar127 = vminps_avx(auVar145,auVar127);
                      auVar24._4_4_ = auVar127._4_4_ * 1.0000004;
                      auVar24._0_4_ = auVar127._0_4_ * 1.0000004;
                      auVar24._8_4_ = auVar127._8_4_ * 1.0000004;
                      auVar24._12_4_ = auVar127._12_4_ * 1.0000004;
                      auVar24._16_4_ = auVar127._16_4_ * 1.0000004;
                      auVar24._20_4_ = auVar127._20_4_ * 1.0000004;
                      auVar24._24_4_ = auVar127._24_4_ * 1.0000004;
                      auVar24._28_4_ = auVar127._28_4_;
                      auVar127 = vmaxps_avx(auVar23,local_2960);
                      auVar145 = vminps_avx(auVar24,local_2940);
                      auVar127 = vcmpps_avx(auVar127,auVar145,2);
                      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar127 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar127 >> 0x7f,0) != '\0') ||
                            (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar127 >> 0xbf,0) != '\0') ||
                          (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar127[0x1f] < '\0') {
                        auVar127 = vblendvps_avx(auVar213._0_32_,auVar23,auVar127);
                        if (uVar92 != 8) {
                          *puVar96 = uVar92;
                          puVar96 = puVar96 + 1;
                          *pauVar99 = auVar224._0_32_;
                          pauVar99 = pauVar99 + 1;
                        }
                        auVar224 = ZEXT3264(auVar127);
                        uVar92 = uVar86;
                      }
                    }
                  } while ((uVar86 != 8) && (bVar100 = uVar97 < 3, uVar97 = uVar97 + 1, bVar100));
                  iVar85 = 0;
                  if (uVar92 == 8) {
LAB_005cc0ba:
                    bVar100 = false;
                    iVar85 = 4;
                  }
                  else {
                    auVar127 = vcmpps_avx(local_2940,auVar224._0_32_,6);
                    uVar98 = vmovmskps_avx(auVar127);
                    bVar100 = true;
                    if ((uint)POPCOUNT(uVar98) <= (uint)uVar93) {
                      *puVar96 = uVar92;
                      puVar96 = puVar96 + 1;
                      *pauVar99 = auVar224._0_32_;
                      pauVar99 = pauVar99 + 1;
                      goto LAB_005cc0ba;
                    }
                  }
                  root.ptr = uVar92;
                } while (bVar100);
              }
            }
          }
        } while (iVar85 != 3);
        auVar127 = vandps_avx(local_2700,local_2c20);
        auVar154._8_4_ = 0xff800000;
        auVar154._0_8_ = 0xff800000ff800000;
        auVar154._12_4_ = 0xff800000;
        auVar154._16_4_ = 0xff800000;
        auVar154._20_4_ = 0xff800000;
        auVar154._24_4_ = 0xff800000;
        auVar154._28_4_ = 0xff800000;
        auVar127 = vmaskmovps_avx(auVar127,auVar154);
        *(undefined1 (*) [32])local_2ef0 = auVar127;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }